

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::sse2::CurveNiMBIntersectorK<4,4>::
     occluded_n<embree::sse2::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  Primitive *pPVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  Primitive PVar11;
  undefined4 uVar12;
  Geometry *pGVar13;
  __int_type_conflict _Var14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined3 uVar23;
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  bool bVar26;
  undefined8 uVar27;
  undefined1 auVar28 [16];
  undefined6 uVar29;
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  bool bVar51;
  byte bVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  RTCFilterFunctionN p_Var56;
  RTCRayN *pRVar57;
  int iVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  long lVar62;
  uint uVar63;
  uint uVar64;
  int iVar65;
  uint uVar66;
  uint uVar67;
  short sVar68;
  float t1;
  undefined2 uVar98;
  float fVar69;
  float fVar99;
  float fVar100;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar101;
  float fVar120;
  float fVar121;
  undefined1 auVar102 [16];
  undefined1 auVar105 [16];
  undefined1 auVar108 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar122;
  float fVar139;
  float fVar140;
  vfloat4 v;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar141;
  float fVar157;
  float fVar159;
  vfloat4 v_1;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar146 [16];
  float fVar158;
  float fVar160;
  float fVar161;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar156 [16];
  float fVar162;
  float fVar163;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar171;
  float fVar195;
  float fVar196;
  vfloat_impl<4> p00;
  undefined1 auVar172 [16];
  undefined1 auVar175 [16];
  undefined1 auVar178 [16];
  undefined1 auVar181 [16];
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  float fVar197;
  float fVar198;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar199;
  float fVar200;
  float fVar210;
  float fVar212;
  undefined1 auVar201 [16];
  float fVar211;
  float fVar213;
  float fVar214;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar227;
  float fVar231;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar223 [16];
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar238;
  float fVar248;
  float fVar249;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar250;
  float fVar262;
  float fVar263;
  undefined1 auVar251 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar264;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  float fVar265;
  float fVar274;
  float fVar275;
  vfloat4 a;
  undefined1 auVar266 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  float fVar276;
  float fVar277;
  float fVar286;
  float fVar288;
  vfloat4 a_2;
  float fVar290;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar282 [16];
  float fVar287;
  float fVar289;
  float fVar291;
  float fVar292;
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  float fVar293;
  float fVar294;
  float fVar303;
  float fVar305;
  float fVar307;
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar299 [16];
  float fVar304;
  float fVar306;
  float fVar308;
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  float fVar320;
  float fVar321;
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_54d;
  uint local_54c;
  undefined8 local_548;
  float fStack_520;
  float fStack_51c;
  undefined8 local_518;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 *local_400;
  Primitive *local_3f8;
  ulong local_3f0;
  long local_3e8;
  ulong local_3e0;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [16];
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  uint auStack_338 [4];
  RTCFilterFunctionNArguments local_328;
  uint local_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint local_2e8;
  uint uStack_2e4;
  uint uStack_2e0;
  uint uStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [16];
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float afStack_108 [8];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  undefined8 auStack_58 [5];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 uVar97;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar155 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  
  PVar11 = prim[1];
  uVar53 = (ulong)(byte)PVar11;
  lVar18 = uVar53 * 0x25;
  pPVar4 = prim + lVar18 + 6;
  fVar140 = *(float *)(pPVar4 + 0xc);
  fVar141 = (*(float *)(ray + k * 4) - *(float *)pPVar4) * fVar140;
  fVar157 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar4 + 4)) * fVar140;
  fVar159 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar4 + 8)) * fVar140;
  fVar122 = *(float *)(ray + k * 4 + 0x40) * fVar140;
  fVar139 = *(float *)(ray + k * 4 + 0x50) * fVar140;
  fVar140 = *(float *)(ray + k * 4 + 0x60) * fVar140;
  uVar12 = *(undefined4 *)(prim + uVar53 * 4 + 6);
  uVar97 = (undefined1)((uint)uVar12 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar12 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar12));
  uVar97 = (undefined1)((uint)uVar12 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar97),uVar97);
  sVar68 = CONCAT11((char)uVar12,(char)uVar12);
  uVar5 = CONCAT62(uVar29,sVar68);
  auVar255._8_4_ = 0;
  auVar255._0_8_ = uVar5;
  auVar255._12_2_ = uVar98;
  auVar255._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar124._12_4_ = auVar255._12_4_;
  auVar124._8_2_ = 0;
  auVar124._0_8_ = uVar5;
  auVar124._10_2_ = uVar98;
  auVar70._10_6_ = auVar124._10_6_;
  auVar70._8_2_ = uVar98;
  auVar70._0_8_ = uVar5;
  uVar98 = (undefined2)uVar29;
  auVar30._4_8_ = auVar70._8_8_;
  auVar30._2_2_ = uVar98;
  auVar30._0_2_ = uVar98;
  fVar309 = (float)((int)sVar68 >> 8);
  fVar315 = (float)(auVar30._0_4_ >> 0x18);
  fVar317 = (float)(auVar70._8_4_ >> 0x18);
  uVar12 = *(undefined4 *)(prim + uVar53 * 5 + 6);
  uVar97 = (undefined1)((uint)uVar12 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar12 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar12));
  uVar97 = (undefined1)((uint)uVar12 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar97),uVar97);
  sVar68 = CONCAT11((char)uVar12,(char)uVar12);
  uVar5 = CONCAT62(uVar29,sVar68);
  auVar104._8_4_ = 0;
  auVar104._0_8_ = uVar5;
  auVar104._12_2_ = uVar98;
  auVar104._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar103._12_4_ = auVar104._12_4_;
  auVar103._8_2_ = 0;
  auVar103._0_8_ = uVar5;
  auVar103._10_2_ = uVar98;
  auVar102._10_6_ = auVar103._10_6_;
  auVar102._8_2_ = uVar98;
  auVar102._0_8_ = uVar5;
  uVar98 = (undefined2)uVar29;
  auVar31._4_8_ = auVar102._8_8_;
  auVar31._2_2_ = uVar98;
  auVar31._0_2_ = uVar98;
  fVar162 = (float)((int)sVar68 >> 8);
  fVar166 = (float)(auVar31._0_4_ >> 0x18);
  fVar168 = (float)(auVar102._8_4_ >> 0x18);
  uVar12 = *(undefined4 *)(prim + uVar53 * 6 + 6);
  uVar97 = (undefined1)((uint)uVar12 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar12 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar12));
  uVar97 = (undefined1)((uint)uVar12 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar97),uVar97);
  sVar68 = CONCAT11((char)uVar12,(char)uVar12);
  uVar5 = CONCAT62(uVar29,sVar68);
  auVar107._8_4_ = 0;
  auVar107._0_8_ = uVar5;
  auVar107._12_2_ = uVar98;
  auVar107._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar106._12_4_ = auVar107._12_4_;
  auVar106._8_2_ = 0;
  auVar106._0_8_ = uVar5;
  auVar106._10_2_ = uVar98;
  auVar105._10_6_ = auVar106._10_6_;
  auVar105._8_2_ = uVar98;
  auVar105._0_8_ = uVar5;
  uVar98 = (undefined2)uVar29;
  auVar32._4_8_ = auVar105._8_8_;
  auVar32._2_2_ = uVar98;
  auVar32._0_2_ = uVar98;
  fVar199 = (float)((int)sVar68 >> 8);
  fVar210 = (float)(auVar32._0_4_ >> 0x18);
  fVar212 = (float)(auVar105._8_4_ >> 0x18);
  uVar12 = *(undefined4 *)(prim + uVar53 * 0xf + 6);
  uVar97 = (undefined1)((uint)uVar12 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar12 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar12));
  uVar97 = (undefined1)((uint)uVar12 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar97),uVar97);
  sVar68 = CONCAT11((char)uVar12,(char)uVar12);
  uVar5 = CONCAT62(uVar29,sVar68);
  auVar110._8_4_ = 0;
  auVar110._0_8_ = uVar5;
  auVar110._12_2_ = uVar98;
  auVar110._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar109._12_4_ = auVar110._12_4_;
  auVar109._8_2_ = 0;
  auVar109._0_8_ = uVar5;
  auVar109._10_2_ = uVar98;
  auVar108._10_6_ = auVar109._10_6_;
  auVar108._8_2_ = uVar98;
  auVar108._0_8_ = uVar5;
  uVar98 = (undefined2)uVar29;
  auVar33._4_8_ = auVar108._8_8_;
  auVar33._2_2_ = uVar98;
  auVar33._0_2_ = uVar98;
  fVar69 = (float)((int)sVar68 >> 8);
  fVar99 = (float)(auVar33._0_4_ >> 0x18);
  fVar100 = (float)(auVar108._8_4_ >> 0x18);
  uVar12 = *(undefined4 *)(prim + (ulong)(byte)PVar11 * 0x10 + 6);
  uVar97 = (undefined1)((uint)uVar12 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar12 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar12));
  uVar97 = (undefined1)((uint)uVar12 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar97),uVar97);
  sVar68 = CONCAT11((char)uVar12,(char)uVar12);
  uVar5 = CONCAT62(uVar29,sVar68);
  auVar174._8_4_ = 0;
  auVar174._0_8_ = uVar5;
  auVar174._12_2_ = uVar98;
  auVar174._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar173._12_4_ = auVar174._12_4_;
  auVar173._8_2_ = 0;
  auVar173._0_8_ = uVar5;
  auVar173._10_2_ = uVar98;
  auVar172._10_6_ = auVar173._10_6_;
  auVar172._8_2_ = uVar98;
  auVar172._0_8_ = uVar5;
  uVar98 = (undefined2)uVar29;
  auVar34._4_8_ = auVar172._8_8_;
  auVar34._2_2_ = uVar98;
  auVar34._0_2_ = uVar98;
  fVar215 = (float)((int)sVar68 >> 8);
  fVar227 = (float)(auVar34._0_4_ >> 0x18);
  fVar231 = (float)(auVar172._8_4_ >> 0x18);
  uVar12 = *(undefined4 *)(prim + (ulong)(byte)PVar11 * 0x10 + uVar53 + 6);
  uVar97 = (undefined1)((uint)uVar12 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar12 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar12));
  uVar97 = (undefined1)((uint)uVar12 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar97),uVar97);
  sVar68 = CONCAT11((char)uVar12,(char)uVar12);
  uVar5 = CONCAT62(uVar29,sVar68);
  auVar177._8_4_ = 0;
  auVar177._0_8_ = uVar5;
  auVar177._12_2_ = uVar98;
  auVar177._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar176._12_4_ = auVar177._12_4_;
  auVar176._8_2_ = 0;
  auVar176._0_8_ = uVar5;
  auVar176._10_2_ = uVar98;
  auVar175._10_6_ = auVar176._10_6_;
  auVar175._8_2_ = uVar98;
  auVar175._0_8_ = uVar5;
  uVar98 = (undefined2)uVar29;
  auVar35._4_8_ = auVar175._8_8_;
  auVar35._2_2_ = uVar98;
  auVar35._0_2_ = uVar98;
  fVar250 = (float)((int)sVar68 >> 8);
  fVar262 = (float)(auVar35._0_4_ >> 0x18);
  fVar263 = (float)(auVar175._8_4_ >> 0x18);
  uVar12 = *(undefined4 *)(prim + uVar53 * 0x1a + 6);
  uVar97 = (undefined1)((uint)uVar12 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar12 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar12));
  uVar97 = (undefined1)((uint)uVar12 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar97),uVar97);
  sVar68 = CONCAT11((char)uVar12,(char)uVar12);
  uVar5 = CONCAT62(uVar29,sVar68);
  auVar180._8_4_ = 0;
  auVar180._0_8_ = uVar5;
  auVar180._12_2_ = uVar98;
  auVar180._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar179._12_4_ = auVar180._12_4_;
  auVar179._8_2_ = 0;
  auVar179._0_8_ = uVar5;
  auVar179._10_2_ = uVar98;
  auVar178._10_6_ = auVar179._10_6_;
  auVar178._8_2_ = uVar98;
  auVar178._0_8_ = uVar5;
  uVar98 = (undefined2)uVar29;
  auVar36._4_8_ = auVar178._8_8_;
  auVar36._2_2_ = uVar98;
  auVar36._0_2_ = uVar98;
  fVar238 = (float)((int)sVar68 >> 8);
  fVar248 = (float)(auVar36._0_4_ >> 0x18);
  fVar249 = (float)(auVar178._8_4_ >> 0x18);
  uVar12 = *(undefined4 *)(prim + uVar53 * 0x1b + 6);
  uVar97 = (undefined1)((uint)uVar12 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar12 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar12));
  uVar97 = (undefined1)((uint)uVar12 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar97),uVar97);
  sVar68 = CONCAT11((char)uVar12,(char)uVar12);
  uVar5 = CONCAT62(uVar29,sVar68);
  auVar183._8_4_ = 0;
  auVar183._0_8_ = uVar5;
  auVar183._12_2_ = uVar98;
  auVar183._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar182._12_4_ = auVar183._12_4_;
  auVar182._8_2_ = 0;
  auVar182._0_8_ = uVar5;
  auVar182._10_2_ = uVar98;
  auVar181._10_6_ = auVar182._10_6_;
  auVar181._8_2_ = uVar98;
  auVar181._0_8_ = uVar5;
  uVar98 = (undefined2)uVar29;
  auVar37._4_8_ = auVar181._8_8_;
  auVar37._2_2_ = uVar98;
  auVar37._0_2_ = uVar98;
  fVar265 = (float)((int)sVar68 >> 8);
  fVar274 = (float)(auVar37._0_4_ >> 0x18);
  fVar275 = (float)(auVar181._8_4_ >> 0x18);
  uVar12 = *(undefined4 *)(prim + uVar53 * 0x1c + 6);
  uVar97 = (undefined1)((uint)uVar12 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar12 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar12));
  uVar97 = (undefined1)((uint)uVar12 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar97),uVar97);
  sVar68 = CONCAT11((char)uVar12,(char)uVar12);
  uVar5 = CONCAT62(uVar29,sVar68);
  auVar186._8_4_ = 0;
  auVar186._0_8_ = uVar5;
  auVar186._12_2_ = uVar98;
  auVar186._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar185._12_4_ = auVar186._12_4_;
  auVar185._8_2_ = 0;
  auVar185._0_8_ = uVar5;
  auVar185._10_2_ = uVar98;
  auVar184._10_6_ = auVar185._10_6_;
  auVar184._8_2_ = uVar98;
  auVar184._0_8_ = uVar5;
  uVar98 = (undefined2)uVar29;
  auVar38._4_8_ = auVar184._8_8_;
  auVar38._2_2_ = uVar98;
  auVar38._0_2_ = uVar98;
  fVar101 = (float)((int)sVar68 >> 8);
  fVar120 = (float)(auVar38._0_4_ >> 0x18);
  fVar121 = (float)(auVar184._8_4_ >> 0x18);
  fVar293 = fVar122 * fVar309 + fVar139 * fVar162 + fVar140 * fVar199;
  fVar303 = fVar122 * fVar315 + fVar139 * fVar166 + fVar140 * fVar210;
  fVar305 = fVar122 * fVar317 + fVar139 * fVar168 + fVar140 * fVar212;
  fVar307 = fVar122 * (float)(auVar124._12_4_ >> 0x18) +
            fVar139 * (float)(auVar103._12_4_ >> 0x18) + fVar140 * (float)(auVar106._12_4_ >> 0x18);
  fVar276 = fVar122 * fVar69 + fVar139 * fVar215 + fVar140 * fVar250;
  fVar286 = fVar122 * fVar99 + fVar139 * fVar227 + fVar140 * fVar262;
  fVar288 = fVar122 * fVar100 + fVar139 * fVar231 + fVar140 * fVar263;
  fVar290 = fVar122 * (float)(auVar109._12_4_ >> 0x18) +
            fVar139 * (float)(auVar173._12_4_ >> 0x18) + fVar140 * (float)(auVar176._12_4_ >> 0x18);
  fVar171 = fVar122 * fVar238 + fVar139 * fVar265 + fVar140 * fVar101;
  fVar195 = fVar122 * fVar248 + fVar139 * fVar274 + fVar140 * fVar120;
  fVar196 = fVar122 * fVar249 + fVar139 * fVar275 + fVar140 * fVar121;
  fVar122 = fVar122 * (float)(auVar179._12_4_ >> 0x18) +
            fVar139 * (float)(auVar182._12_4_ >> 0x18) + fVar140 * (float)(auVar185._12_4_ >> 0x18);
  fVar310 = fVar309 * fVar141 + fVar162 * fVar157 + fVar199 * fVar159;
  fVar315 = fVar315 * fVar141 + fVar166 * fVar157 + fVar210 * fVar159;
  fVar317 = fVar317 * fVar141 + fVar168 * fVar157 + fVar212 * fVar159;
  fVar318 = (float)(auVar124._12_4_ >> 0x18) * fVar141 +
            (float)(auVar103._12_4_ >> 0x18) * fVar157 + (float)(auVar106._12_4_ >> 0x18) * fVar159;
  fVar250 = fVar69 * fVar141 + fVar215 * fVar157 + fVar250 * fVar159;
  fVar262 = fVar99 * fVar141 + fVar227 * fVar157 + fVar262 * fVar159;
  fVar263 = fVar100 * fVar141 + fVar231 * fVar157 + fVar263 * fVar159;
  fVar309 = (float)(auVar109._12_4_ >> 0x18) * fVar141 +
            (float)(auVar173._12_4_ >> 0x18) * fVar157 + (float)(auVar176._12_4_ >> 0x18) * fVar159;
  fVar238 = fVar141 * fVar238 + fVar157 * fVar265 + fVar159 * fVar101;
  fVar248 = fVar141 * fVar248 + fVar157 * fVar274 + fVar159 * fVar120;
  fVar249 = fVar141 * fVar249 + fVar157 * fVar275 + fVar159 * fVar121;
  fVar265 = fVar141 * (float)(auVar179._12_4_ >> 0x18) +
            fVar157 * (float)(auVar182._12_4_ >> 0x18) + fVar159 * (float)(auVar185._12_4_ >> 0x18);
  fVar140 = (float)DAT_01ff1d40;
  fVar69 = DAT_01ff1d40._4_4_;
  fVar99 = DAT_01ff1d40._8_4_;
  fVar100 = DAT_01ff1d40._12_4_;
  uVar63 = -(uint)(fVar140 <= ABS(fVar293));
  uVar64 = -(uint)(fVar69 <= ABS(fVar303));
  uVar66 = -(uint)(fVar99 <= ABS(fVar305));
  uVar67 = -(uint)(fVar100 <= ABS(fVar307));
  auVar295._0_4_ = (uint)fVar293 & uVar63;
  auVar295._4_4_ = (uint)fVar303 & uVar64;
  auVar295._8_4_ = (uint)fVar305 & uVar66;
  auVar295._12_4_ = (uint)fVar307 & uVar67;
  auVar142._0_4_ = ~uVar63 & (uint)fVar140;
  auVar142._4_4_ = ~uVar64 & (uint)fVar69;
  auVar142._8_4_ = ~uVar66 & (uint)fVar99;
  auVar142._12_4_ = ~uVar67 & (uint)fVar100;
  auVar142 = auVar142 | auVar295;
  uVar63 = -(uint)(fVar140 <= ABS(fVar276));
  uVar64 = -(uint)(fVar69 <= ABS(fVar286));
  uVar66 = -(uint)(fVar99 <= ABS(fVar288));
  uVar67 = -(uint)(fVar100 <= ABS(fVar290));
  auVar278._0_4_ = (uint)fVar276 & uVar63;
  auVar278._4_4_ = (uint)fVar286 & uVar64;
  auVar278._8_4_ = (uint)fVar288 & uVar66;
  auVar278._12_4_ = (uint)fVar290 & uVar67;
  auVar201._0_4_ = ~uVar63 & (uint)fVar140;
  auVar201._4_4_ = ~uVar64 & (uint)fVar69;
  auVar201._8_4_ = ~uVar66 & (uint)fVar99;
  auVar201._12_4_ = ~uVar67 & (uint)fVar100;
  auVar201 = auVar201 | auVar278;
  uVar63 = -(uint)(fVar140 <= ABS(fVar171));
  uVar64 = -(uint)(fVar69 <= ABS(fVar195));
  uVar66 = -(uint)(fVar99 <= ABS(fVar196));
  uVar67 = -(uint)(fVar100 <= ABS(fVar122));
  auVar187._0_4_ = (uint)fVar171 & uVar63;
  auVar187._4_4_ = (uint)fVar195 & uVar64;
  auVar187._8_4_ = (uint)fVar196 & uVar66;
  auVar187._12_4_ = (uint)fVar122 & uVar67;
  auVar219._0_4_ = ~uVar63 & (uint)fVar140;
  auVar219._4_4_ = ~uVar64 & (uint)fVar69;
  auVar219._8_4_ = ~uVar66 & (uint)fVar99;
  auVar219._12_4_ = ~uVar67 & (uint)fVar100;
  auVar219 = auVar219 | auVar187;
  auVar70 = rcpps(_DAT_01ff1d40,auVar142);
  fVar140 = auVar70._0_4_;
  fVar100 = auVar70._4_4_;
  fVar162 = auVar70._8_4_;
  fVar215 = auVar70._12_4_;
  fVar140 = (1.0 - auVar142._0_4_ * fVar140) * fVar140 + fVar140;
  fVar100 = (1.0 - auVar142._4_4_ * fVar100) * fVar100 + fVar100;
  fVar162 = (1.0 - auVar142._8_4_ * fVar162) * fVar162 + fVar162;
  fVar215 = (1.0 - auVar142._12_4_ * fVar215) * fVar215 + fVar215;
  auVar70 = rcpps(auVar70,auVar201);
  fVar69 = auVar70._0_4_;
  fVar101 = auVar70._4_4_;
  fVar166 = auVar70._8_4_;
  fVar227 = auVar70._12_4_;
  fVar69 = (1.0 - auVar201._0_4_ * fVar69) * fVar69 + fVar69;
  fVar101 = (1.0 - auVar201._4_4_ * fVar101) * fVar101 + fVar101;
  fVar166 = (1.0 - auVar201._8_4_ * fVar166) * fVar166 + fVar166;
  fVar227 = (1.0 - auVar201._12_4_ * fVar227) * fVar227 + fVar227;
  auVar70 = rcpps(auVar70,auVar219);
  fVar99 = auVar70._0_4_;
  fVar120 = auVar70._4_4_;
  fVar168 = auVar70._8_4_;
  fVar231 = auVar70._12_4_;
  fVar99 = (1.0 - auVar219._0_4_ * fVar99) * fVar99 + fVar99;
  fVar120 = (1.0 - auVar219._4_4_ * fVar120) * fVar120 + fVar120;
  fVar168 = (1.0 - auVar219._8_4_ * fVar168) * fVar168 + fVar168;
  fVar231 = (1.0 - auVar219._12_4_ * fVar231) * fVar231 + fVar231;
  fVar274 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar18 + 0x16)) *
            *(float *)(prim + lVar18 + 0x1a);
  uVar5 = *(ulong *)(prim + uVar53 * 7 + 6);
  uVar98 = (undefined2)(uVar5 >> 0x30);
  auVar323._8_4_ = 0;
  auVar323._0_8_ = uVar5;
  auVar323._12_2_ = uVar98;
  auVar323._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar5 >> 0x20);
  auVar126._12_4_ = auVar323._12_4_;
  auVar126._8_2_ = 0;
  auVar126._0_8_ = uVar5;
  auVar126._10_2_ = uVar98;
  auVar71._10_6_ = auVar126._10_6_;
  auVar71._8_2_ = uVar98;
  auVar71._0_8_ = uVar5;
  uVar98 = (undefined2)(uVar5 >> 0x10);
  auVar39._4_8_ = auVar71._8_8_;
  auVar39._2_2_ = uVar98;
  auVar39._0_2_ = uVar98;
  fVar121 = (float)(auVar39._0_4_ >> 0x10);
  fVar171 = (float)(auVar71._8_4_ >> 0x10);
  uVar59 = *(ulong *)(prim + uVar53 * 0xb + 6);
  uVar98 = (undefined2)(uVar59 >> 0x30);
  auVar145._8_4_ = 0;
  auVar145._0_8_ = uVar59;
  auVar145._12_2_ = uVar98;
  auVar145._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar59 >> 0x20);
  auVar144._12_4_ = auVar145._12_4_;
  auVar144._8_2_ = 0;
  auVar144._0_8_ = uVar59;
  auVar144._10_2_ = uVar98;
  auVar143._10_6_ = auVar144._10_6_;
  auVar143._8_2_ = uVar98;
  auVar143._0_8_ = uVar59;
  uVar98 = (undefined2)(uVar59 >> 0x10);
  auVar40._4_8_ = auVar143._8_8_;
  auVar40._2_2_ = uVar98;
  auVar40._0_2_ = uVar98;
  uVar54 = *(ulong *)(prim + uVar53 * 9 + 6);
  uVar98 = (undefined2)(uVar54 >> 0x30);
  auVar74._8_4_ = 0;
  auVar74._0_8_ = uVar54;
  auVar74._12_2_ = uVar98;
  auVar74._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar54 >> 0x20);
  auVar73._12_4_ = auVar74._12_4_;
  auVar73._8_2_ = 0;
  auVar73._0_8_ = uVar54;
  auVar73._10_2_ = uVar98;
  auVar72._10_6_ = auVar73._10_6_;
  auVar72._8_2_ = uVar98;
  auVar72._0_8_ = uVar54;
  uVar98 = (undefined2)(uVar54 >> 0x10);
  auVar41._4_8_ = auVar72._8_8_;
  auVar41._2_2_ = uVar98;
  auVar41._0_2_ = uVar98;
  fVar122 = (float)(auVar41._0_4_ >> 0x10);
  fVar195 = (float)(auVar72._8_4_ >> 0x10);
  uVar55 = *(ulong *)(prim + uVar53 * 0xd + 6);
  uVar98 = (undefined2)(uVar55 >> 0x30);
  auVar222._8_4_ = 0;
  auVar222._0_8_ = uVar55;
  auVar222._12_2_ = uVar98;
  auVar222._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar55 >> 0x20);
  auVar221._12_4_ = auVar222._12_4_;
  auVar221._8_2_ = 0;
  auVar221._0_8_ = uVar55;
  auVar221._10_2_ = uVar98;
  auVar220._10_6_ = auVar221._10_6_;
  auVar220._8_2_ = uVar98;
  auVar220._0_8_ = uVar55;
  uVar98 = (undefined2)(uVar55 >> 0x10);
  auVar42._4_8_ = auVar220._8_8_;
  auVar42._2_2_ = uVar98;
  auVar42._0_2_ = uVar98;
  uVar60 = *(ulong *)(prim + uVar53 * 0x12 + 6);
  uVar98 = (undefined2)(uVar60 >> 0x30);
  auVar77._8_4_ = 0;
  auVar77._0_8_ = uVar60;
  auVar77._12_2_ = uVar98;
  auVar77._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar60 >> 0x20);
  auVar76._12_4_ = auVar77._12_4_;
  auVar76._8_2_ = 0;
  auVar76._0_8_ = uVar60;
  auVar76._10_2_ = uVar98;
  auVar75._10_6_ = auVar76._10_6_;
  auVar75._8_2_ = uVar98;
  auVar75._0_8_ = uVar60;
  uVar98 = (undefined2)(uVar60 >> 0x10);
  auVar43._4_8_ = auVar75._8_8_;
  auVar43._2_2_ = uVar98;
  auVar43._0_2_ = uVar98;
  fVar139 = (float)(auVar43._0_4_ >> 0x10);
  fVar196 = (float)(auVar75._8_4_ >> 0x10);
  uVar61 = (ulong)(uint)((int)(uVar53 * 5) << 2);
  uVar6 = *(ulong *)(prim + uVar53 * 2 + uVar61 + 6);
  uVar98 = (undefined2)(uVar6 >> 0x30);
  auVar253._8_4_ = 0;
  auVar253._0_8_ = uVar6;
  auVar253._12_2_ = uVar98;
  auVar253._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar6 >> 0x20);
  auVar252._12_4_ = auVar253._12_4_;
  auVar252._8_2_ = 0;
  auVar252._0_8_ = uVar6;
  auVar252._10_2_ = uVar98;
  auVar251._10_6_ = auVar252._10_6_;
  auVar251._8_2_ = uVar98;
  auVar251._0_8_ = uVar6;
  uVar98 = (undefined2)(uVar6 >> 0x10);
  auVar44._4_8_ = auVar251._8_8_;
  auVar44._2_2_ = uVar98;
  auVar44._0_2_ = uVar98;
  uVar61 = *(ulong *)(prim + uVar61 + 6);
  uVar98 = (undefined2)(uVar61 >> 0x30);
  auVar80._8_4_ = 0;
  auVar80._0_8_ = uVar61;
  auVar80._12_2_ = uVar98;
  auVar80._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar61 >> 0x20);
  auVar79._12_4_ = auVar80._12_4_;
  auVar79._8_2_ = 0;
  auVar79._0_8_ = uVar61;
  auVar79._10_2_ = uVar98;
  auVar78._10_6_ = auVar79._10_6_;
  auVar78._8_2_ = uVar98;
  auVar78._0_8_ = uVar61;
  uVar98 = (undefined2)(uVar61 >> 0x10);
  auVar45._4_8_ = auVar78._8_8_;
  auVar45._2_2_ = uVar98;
  auVar45._0_2_ = uVar98;
  fVar141 = (float)(auVar45._0_4_ >> 0x10);
  fVar199 = (float)(auVar78._8_4_ >> 0x10);
  uVar7 = *(ulong *)(prim + uVar53 * 0x18 + 6);
  uVar98 = (undefined2)(uVar7 >> 0x30);
  auVar268._8_4_ = 0;
  auVar268._0_8_ = uVar7;
  auVar268._12_2_ = uVar98;
  auVar268._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar7 >> 0x20);
  auVar267._12_4_ = auVar268._12_4_;
  auVar267._8_2_ = 0;
  auVar267._0_8_ = uVar7;
  auVar267._10_2_ = uVar98;
  auVar266._10_6_ = auVar267._10_6_;
  auVar266._8_2_ = uVar98;
  auVar266._0_8_ = uVar7;
  uVar98 = (undefined2)(uVar7 >> 0x10);
  auVar46._4_8_ = auVar266._8_8_;
  auVar46._2_2_ = uVar98;
  auVar46._0_2_ = uVar98;
  uVar8 = *(ulong *)(prim + uVar53 * 0x1d + 6);
  uVar98 = (undefined2)(uVar8 >> 0x30);
  auVar83._8_4_ = 0;
  auVar83._0_8_ = uVar8;
  auVar83._12_2_ = uVar98;
  auVar83._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar8 >> 0x20);
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._8_2_ = 0;
  auVar82._0_8_ = uVar8;
  auVar82._10_2_ = uVar98;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._8_2_ = uVar98;
  auVar81._0_8_ = uVar8;
  uVar98 = (undefined2)(uVar8 >> 0x10);
  auVar47._4_8_ = auVar81._8_8_;
  auVar47._2_2_ = uVar98;
  auVar47._0_2_ = uVar98;
  fVar157 = (float)(auVar47._0_4_ >> 0x10);
  fVar210 = (float)(auVar81._8_4_ >> 0x10);
  uVar9 = *(ulong *)(prim + uVar53 + (ulong)(byte)PVar11 * 0x20 + 6);
  uVar98 = (undefined2)(uVar9 >> 0x30);
  auVar281._8_4_ = 0;
  auVar281._0_8_ = uVar9;
  auVar281._12_2_ = uVar98;
  auVar281._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar9 >> 0x20);
  auVar280._12_4_ = auVar281._12_4_;
  auVar280._8_2_ = 0;
  auVar280._0_8_ = uVar9;
  auVar280._10_2_ = uVar98;
  auVar279._10_6_ = auVar280._10_6_;
  auVar279._8_2_ = uVar98;
  auVar279._0_8_ = uVar9;
  uVar98 = (undefined2)(uVar9 >> 0x10);
  auVar48._4_8_ = auVar279._8_8_;
  auVar48._2_2_ = uVar98;
  auVar48._0_2_ = uVar98;
  uVar10 = *(ulong *)(prim + ((ulong)(byte)PVar11 * 0x20 - uVar53) + 6);
  uVar98 = (undefined2)(uVar10 >> 0x30);
  auVar86._8_4_ = 0;
  auVar86._0_8_ = uVar10;
  auVar86._12_2_ = uVar98;
  auVar86._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar10 >> 0x20);
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar10;
  auVar85._10_2_ = uVar98;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._8_2_ = uVar98;
  auVar84._0_8_ = uVar10;
  uVar98 = (undefined2)(uVar10 >> 0x10);
  auVar49._4_8_ = auVar84._8_8_;
  auVar49._2_2_ = uVar98;
  auVar49._0_2_ = uVar98;
  fVar159 = (float)(auVar49._0_4_ >> 0x10);
  fVar212 = (float)(auVar84._8_4_ >> 0x10);
  uVar53 = *(ulong *)(prim + uVar53 * 0x23 + 6);
  uVar98 = (undefined2)(uVar53 >> 0x30);
  auVar298._8_4_ = 0;
  auVar298._0_8_ = uVar53;
  auVar298._12_2_ = uVar98;
  auVar298._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar53 >> 0x20);
  auVar297._12_4_ = auVar298._12_4_;
  auVar297._8_2_ = 0;
  auVar297._0_8_ = uVar53;
  auVar297._10_2_ = uVar98;
  auVar296._10_6_ = auVar297._10_6_;
  auVar296._8_2_ = uVar98;
  auVar296._0_8_ = uVar53;
  uVar98 = (undefined2)(uVar53 >> 0x10);
  auVar50._4_8_ = auVar296._8_8_;
  auVar50._2_2_ = uVar98;
  auVar50._0_2_ = uVar98;
  auVar146._0_8_ =
       CONCAT44(((((float)(auVar40._0_4_ >> 0x10) - fVar121) * fVar274 + fVar121) - fVar315) *
                fVar100,((((float)(int)(short)uVar59 - (float)(int)(short)uVar5) * fVar274 +
                         (float)(int)(short)uVar5) - fVar310) * fVar140);
  auVar146._8_4_ =
       ((((float)(auVar143._8_4_ >> 0x10) - fVar171) * fVar274 + fVar171) - fVar317) * fVar162;
  auVar146._12_4_ =
       ((((float)(auVar144._12_4_ >> 0x10) - (float)(auVar126._12_4_ >> 0x10)) * fVar274 +
        (float)(auVar126._12_4_ >> 0x10)) - fVar318) * fVar215;
  auVar223._0_4_ =
       ((((float)(int)(short)uVar55 - (float)(int)(short)uVar54) * fVar274 +
        (float)(int)(short)uVar54) - fVar310) * fVar140;
  auVar223._4_4_ =
       ((((float)(auVar42._0_4_ >> 0x10) - fVar122) * fVar274 + fVar122) - fVar315) * fVar100;
  auVar223._8_4_ =
       ((((float)(auVar220._8_4_ >> 0x10) - fVar195) * fVar274 + fVar195) - fVar317) * fVar162;
  auVar223._12_4_ =
       ((((float)(auVar221._12_4_ >> 0x10) - (float)(auVar73._12_4_ >> 0x10)) * fVar274 +
        (float)(auVar73._12_4_ >> 0x10)) - fVar318) * fVar215;
  auVar254._0_8_ =
       CONCAT44(((((float)(auVar44._0_4_ >> 0x10) - fVar139) * fVar274 + fVar139) - fVar262) *
                fVar101,((((float)(int)(short)uVar6 - (float)(int)(short)uVar60) * fVar274 +
                         (float)(int)(short)uVar60) - fVar250) * fVar69);
  auVar254._8_4_ =
       ((((float)(auVar251._8_4_ >> 0x10) - fVar196) * fVar274 + fVar196) - fVar263) * fVar166;
  auVar254._12_4_ =
       ((((float)(auVar252._12_4_ >> 0x10) - (float)(auVar76._12_4_ >> 0x10)) * fVar274 +
        (float)(auVar76._12_4_ >> 0x10)) - fVar309) * fVar227;
  auVar269._0_4_ =
       ((((float)(int)(short)uVar7 - (float)(int)(short)uVar61) * fVar274 +
        (float)(int)(short)uVar61) - fVar250) * fVar69;
  auVar269._4_4_ =
       ((((float)(auVar46._0_4_ >> 0x10) - fVar141) * fVar274 + fVar141) - fVar262) * fVar101;
  auVar269._8_4_ =
       ((((float)(auVar266._8_4_ >> 0x10) - fVar199) * fVar274 + fVar199) - fVar263) * fVar166;
  auVar269._12_4_ =
       ((((float)(auVar267._12_4_ >> 0x10) - (float)(auVar79._12_4_ >> 0x10)) * fVar274 +
        (float)(auVar79._12_4_ >> 0x10)) - fVar309) * fVar227;
  uVar12 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar282._0_8_ =
       CONCAT44(((((float)(auVar48._0_4_ >> 0x10) - fVar157) * fVar274 + fVar157) - fVar248) *
                fVar120,((((float)(int)(short)uVar9 - (float)(int)(short)uVar8) * fVar274 +
                         (float)(int)(short)uVar8) - fVar238) * fVar99);
  auVar282._8_4_ =
       ((((float)(auVar279._8_4_ >> 0x10) - fVar210) * fVar274 + fVar210) - fVar249) * fVar168;
  auVar282._12_4_ =
       ((((float)(auVar280._12_4_ >> 0x10) - (float)(auVar82._12_4_ >> 0x10)) * fVar274 +
        (float)(auVar82._12_4_ >> 0x10)) - fVar265) * fVar231;
  auVar299._0_4_ =
       ((((float)(int)(short)uVar53 - (float)(int)(short)uVar10) * fVar274 +
        (float)(int)(short)uVar10) - fVar238) * fVar99;
  auVar299._4_4_ =
       ((((float)(auVar50._0_4_ >> 0x10) - fVar159) * fVar274 + fVar159) - fVar248) * fVar120;
  auVar299._8_4_ =
       ((((float)(auVar296._8_4_ >> 0x10) - fVar212) * fVar274 + fVar212) - fVar249) * fVar168;
  auVar299._12_4_ =
       ((((float)(auVar297._12_4_ >> 0x10) - (float)(auVar85._12_4_ >> 0x10)) * fVar274 +
        (float)(auVar85._12_4_ >> 0x10)) - fVar265) * fVar231;
  auVar123._8_4_ = auVar146._8_4_;
  auVar123._0_8_ = auVar146._0_8_;
  auVar123._12_4_ = auVar146._12_4_;
  auVar124 = minps(auVar123,auVar223);
  auVar111._8_4_ = auVar254._8_4_;
  auVar111._0_8_ = auVar254._0_8_;
  auVar111._12_4_ = auVar254._12_4_;
  auVar70 = minps(auVar111,auVar269);
  auVar124 = maxps(auVar124,auVar70);
  auVar112._8_4_ = auVar282._8_4_;
  auVar112._0_8_ = auVar282._0_8_;
  auVar112._12_4_ = auVar282._12_4_;
  auVar70 = minps(auVar112,auVar299);
  auVar87._4_4_ = uVar12;
  auVar87._0_4_ = uVar12;
  auVar87._8_4_ = uVar12;
  auVar87._12_4_ = uVar12;
  auVar70 = maxps(auVar70,auVar87);
  auVar70 = maxps(auVar124,auVar70);
  auVar124 = maxps(auVar146,auVar223);
  auVar255 = maxps(auVar254,auVar269);
  auVar124 = minps(auVar124,auVar255);
  auVar255 = maxps(auVar282,auVar299);
  uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar88._4_4_ = uVar12;
  auVar88._0_4_ = uVar12;
  auVar88._8_4_ = uVar12;
  auVar88._12_4_ = uVar12;
  auVar255 = minps(auVar255,auVar88);
  local_298 = auVar70._0_4_ * 0.99999964;
  fStack_294 = auVar70._4_4_ * 0.99999964;
  fStack_290 = auVar70._8_4_ * 0.99999964;
  fStack_28c = auVar70._12_4_ * 0.99999964;
  auVar70 = minps(auVar124,auVar255);
  uVar63 = (uint)(byte)PVar11;
  auVar89._0_4_ = -(uint)(local_298 <= auVar70._0_4_ * 1.0000004 && uVar63 != 0);
  auVar89._4_4_ = -(uint)(fStack_294 <= auVar70._4_4_ * 1.0000004 && 1 < uVar63);
  auVar89._8_4_ = -(uint)(fStack_290 <= auVar70._8_4_ * 1.0000004 && 2 < uVar63);
  auVar89._12_4_ = -(uint)(fStack_28c <= auVar70._12_4_ * 1.0000004 && 3 < uVar63);
  uVar63 = movmskps(uVar63,auVar89);
  local_54d = uVar63 != 0;
  if (uVar63 == 0) {
    return local_54d;
  }
  uVar63 = uVar63 & 0xff;
  local_278._0_12_ = mm_lookupmask_ps._240_12_;
  local_278._12_4_ = 0;
  local_400 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_3f8 = prim;
LAB_00bf71ef:
  local_3e0 = (ulong)uVar63;
  lVar18 = 0;
  if (local_3e0 != 0) {
    for (; (uVar63 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
    }
  }
  uVar63 = *(uint *)(local_3f8 + 2);
  uVar64 = *(uint *)(local_3f8 + lVar18 * 4 + 6);
  pGVar13 = (context->scene->geometries).items[uVar63].ptr;
  fVar140 = pGVar13->fnumTimeSegments;
  fVar69 = (pGVar13->time_range).lower;
  fVar99 = ((*(float *)(ray + k * 4 + 0x70) - fVar69) / ((pGVar13->time_range).upper - fVar69)) *
           fVar140;
  fVar69 = floorf(fVar99);
  uVar5 = local_3e0;
  fVar140 = fVar140 + -1.0;
  if (fVar140 <= fVar69) {
    fVar69 = fVar140;
  }
  fVar140 = 0.0;
  if (0.0 <= fVar69) {
    fVar140 = fVar69;
  }
  uVar54 = (ulong)*(uint *)(*(long *)&pGVar13->field_0x58 +
                           (ulong)uVar64 *
                           pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var14 = pGVar13[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar62 = (long)(int)fVar140 * 0x38;
  lVar15 = *(long *)(_Var14 + lVar62);
  lVar16 = *(long *)(_Var14 + 0x10 + lVar62);
  pfVar3 = (float *)(lVar15 + lVar16 * uVar54);
  fVar69 = *pfVar3;
  fVar100 = pfVar3[1];
  fVar101 = pfVar3[2];
  fVar120 = pfVar3[3];
  lVar18 = uVar54 + 1;
  pfVar3 = (float *)(lVar15 + lVar16 * lVar18);
  fVar121 = *pfVar3;
  fVar122 = pfVar3[1];
  fVar139 = pfVar3[2];
  fVar141 = pfVar3[3];
  lVar1 = uVar54 + 2;
  pfVar3 = (float *)(lVar15 + lVar16 * lVar1);
  fVar157 = *pfVar3;
  fVar159 = pfVar3[1];
  fVar162 = pfVar3[2];
  fVar166 = pfVar3[3];
  lVar2 = uVar54 + 3;
  pfVar3 = (float *)(lVar15 + lVar16 * lVar2);
  fVar168 = *pfVar3;
  fVar171 = pfVar3[1];
  fVar195 = pfVar3[2];
  fVar196 = pfVar3[3];
  lVar15 = *(long *)&pGVar13[4].fnumTimeSegments;
  lVar16 = *(long *)(lVar15 + lVar62);
  lVar17 = *(long *)(lVar15 + 0x10 + lVar62);
  pfVar3 = (float *)(lVar16 + lVar17 * uVar54);
  fVar199 = *pfVar3;
  fVar210 = pfVar3[1];
  fVar212 = pfVar3[2];
  fVar215 = pfVar3[3];
  pfVar3 = (float *)(lVar16 + lVar17 * lVar18);
  fVar227 = *pfVar3;
  fVar231 = pfVar3[1];
  fVar250 = pfVar3[2];
  fVar262 = pfVar3[3];
  pfVar3 = (float *)(lVar16 + lVar17 * lVar1);
  fVar263 = *pfVar3;
  fVar309 = pfVar3[1];
  fVar238 = pfVar3[2];
  fVar248 = pfVar3[3];
  fVar99 = fVar99 - fVar140;
  pfVar3 = (float *)(lVar16 + lVar17 * lVar2);
  fVar140 = *pfVar3;
  fVar249 = pfVar3[1];
  fVar265 = pfVar3[2];
  fVar274 = pfVar3[3];
  fVar275 = fVar69 * 0.16666667 + fVar121 * 0.6666667 + fVar157 * 0.16666667 + fVar168 * 0.0;
  fVar286 = fVar100 * 0.16666667 + fVar122 * 0.6666667 + fVar159 * 0.16666667 + fVar171 * 0.0;
  fVar290 = fVar101 * 0.16666667 + fVar139 * 0.6666667 + fVar162 * 0.16666667 + fVar195 * 0.0;
  fVar303 = fVar120 * 0.16666667 + fVar141 * 0.6666667 + fVar166 * 0.16666667 + fVar196 * 0.0;
  fVar318 = ((fVar157 * 0.5 + fVar168 * 0.0) - fVar121 * 0.0) - fVar69 * 0.5;
  fVar158 = ((fVar159 * 0.5 + fVar171 * 0.0) - fVar122 * 0.0) - fVar100 * 0.5;
  fVar160 = ((fVar162 * 0.5 + fVar195 * 0.0) - fVar139 * 0.0) - fVar101 * 0.5;
  fVar161 = ((fVar166 * 0.5 + fVar196 * 0.0) - fVar141 * 0.0) - fVar120 * 0.5;
  fVar305 = fVar199 * 0.16666667 + fVar227 * 0.6666667 + fVar263 * 0.16666667 + fVar140 * 0.0;
  fVar304 = fVar210 * 0.16666667 + fVar231 * 0.6666667 + fVar309 * 0.16666667 + fVar249 * 0.0;
  fVar306 = fVar212 * 0.16666667 + fVar250 * 0.6666667 + fVar238 * 0.16666667 + fVar265 * 0.0;
  fVar308 = fVar215 * 0.16666667 + fVar262 * 0.6666667 + fVar248 * 0.16666667 + fVar274 * 0.0;
  fVar276 = ((fVar263 * 0.5 + fVar140 * 0.0) - fVar227 * 0.0) - fVar199 * 0.5;
  fVar288 = ((fVar309 * 0.5 + fVar249 * 0.0) - fVar231 * 0.0) - fVar210 * 0.5;
  fVar293 = ((fVar238 * 0.5 + fVar265 * 0.0) - fVar250 * 0.0) - fVar212 * 0.5;
  fVar291 = ((fVar248 * 0.5 + fVar274 * 0.0) - fVar262 * 0.0) - fVar215 * 0.5;
  fVar163 = fVar121 * 0.16666667 + fVar157 * 0.6666667 + fVar168 * 0.16666667 + fVar69 * 0.0;
  fVar167 = fVar122 * 0.16666667 + fVar159 * 0.6666667 + fVar171 * 0.16666667 + fVar100 * 0.0;
  fVar169 = fVar139 * 0.16666667 + fVar162 * 0.6666667 + fVar195 * 0.16666667 + fVar101 * 0.0;
  fVar170 = fVar141 * 0.16666667 + fVar166 * 0.6666667 + fVar196 * 0.16666667 + fVar120 * 0.0;
  fVar307 = ((fVar157 * 0.0 + fVar168 * 0.5) - fVar121 * 0.5) - fVar69 * 0.0;
  fVar310 = ((fVar159 * 0.0 + fVar171 * 0.5) - fVar122 * 0.5) - fVar100 * 0.0;
  fVar315 = ((fVar162 * 0.0 + fVar195 * 0.5) - fVar139 * 0.5) - fVar101 * 0.0;
  fVar317 = ((fVar166 * 0.0 + fVar196 * 0.5) - fVar141 * 0.5) - fVar120 * 0.0;
  fVar101 = fVar227 * 0.16666667 + fVar263 * 0.6666667 + fVar140 * 0.16666667 + fVar199 * 0.0;
  fVar120 = fVar231 * 0.16666667 + fVar309 * 0.6666667 + fVar249 * 0.16666667 + fVar210 * 0.0;
  fVar121 = fVar250 * 0.16666667 + fVar238 * 0.6666667 + fVar265 * 0.16666667 + fVar212 * 0.0;
  fVar122 = fVar262 * 0.16666667 + fVar248 * 0.6666667 + fVar274 * 0.16666667 + fVar215 * 0.0;
  fVar140 = ((fVar263 * 0.0 + fVar140 * 0.5) - fVar227 * 0.5) - fVar199 * 0.0;
  fVar69 = ((fVar309 * 0.0 + fVar249 * 0.5) - fVar231 * 0.5) - fVar210 * 0.0;
  fVar100 = ((fVar238 * 0.0 + fVar265 * 0.5) - fVar250 * 0.5) - fVar212 * 0.0;
  fVar199 = ((fVar248 * 0.0 + fVar274 * 0.5) - fVar262 * 0.5) - fVar215 * 0.0;
  fVar311 = fVar158 * fVar305 - fVar304 * fVar318;
  fVar316 = fVar160 * fVar304 - fVar306 * fVar158;
  fVar306 = fVar318 * fVar306 - fVar305 * fVar160;
  fVar319 = fVar161 * fVar308 - fVar308 * fVar161;
  fVar215 = fVar158 * fVar276 - fVar288 * fVar318;
  fVar231 = fVar160 * fVar288 - fVar293 * fVar158;
  fVar250 = fVar318 * fVar293 - fVar276 * fVar160;
  fVar238 = fVar310 * fVar101 - fVar120 * fVar307;
  fVar248 = fVar315 * fVar120 - fVar121 * fVar310;
  fVar249 = fVar307 * fVar121 - fVar101 * fVar315;
  fVar265 = fVar317 * fVar122 - fVar122 * fVar317;
  fVar262 = fVar310 * fVar140 - fVar69 * fVar307;
  fVar263 = fVar315 * fVar69 - fVar100 * fVar310;
  fVar309 = fVar307 * fVar100 - fVar140 * fVar315;
  fVar196 = fVar306 * fVar306 + fVar316 * fVar316 + fVar311 * fVar311;
  auVar70 = ZEXT416((uint)fVar196);
  auVar124 = rsqrtss(ZEXT416((uint)fVar196),auVar70);
  fVar140 = auVar124._0_4_;
  fVar274 = fVar140 * 1.5 - fVar140 * fVar140 * fVar196 * 0.5 * fVar140;
  fVar304 = fVar311 * fVar215 + fVar306 * fVar250 + fVar316 * fVar231;
  fVar212 = fVar319 * fVar274;
  auVar70 = rcpss(auVar70,auVar70);
  fVar227 = (2.0 - fVar196 * auVar70._0_4_) * auVar70._0_4_;
  fVar294 = fVar249 * fVar249 + fVar248 * fVar248 + fVar238 * fVar238;
  auVar124 = ZEXT416((uint)fVar294);
  auVar70 = rsqrtss(ZEXT416((uint)fVar294),auVar124);
  fVar140 = auVar70._0_4_;
  fVar308 = fVar140 * 1.5 - fVar140 * fVar140 * fVar294 * 0.5 * fVar140;
  fVar320 = fVar238 * fVar262 + fVar249 * fVar309 + fVar248 * fVar263;
  lVar16 = *(long *)(_Var14 + 0x38 + lVar62);
  lVar17 = *(long *)(_Var14 + 0x48 + lVar62);
  pfVar3 = (float *)(lVar16 + lVar17 * uVar54);
  fVar140 = *pfVar3;
  fVar69 = pfVar3[1];
  fVar100 = pfVar3[2];
  fVar101 = pfVar3[3];
  pfVar3 = (float *)(lVar16 + lVar17 * lVar18);
  fVar120 = *pfVar3;
  fVar121 = pfVar3[1];
  fVar122 = pfVar3[2];
  fVar139 = pfVar3[3];
  pfVar3 = (float *)(lVar16 + lVar17 * lVar1);
  fVar141 = *pfVar3;
  fVar157 = pfVar3[1];
  fVar159 = pfVar3[2];
  fVar162 = pfVar3[3];
  auVar70 = rcpss(auVar124,auVar124);
  pfVar3 = (float *)(lVar16 + lVar17 * lVar2);
  fVar166 = *pfVar3;
  fVar168 = pfVar3[1];
  fVar171 = pfVar3[2];
  fVar195 = pfVar3[3];
  lVar16 = *(long *)(lVar15 + 0x38 + lVar62);
  lVar15 = *(long *)(lVar15 + 0x48 + lVar62);
  uVar59 = lVar18 * lVar15;
  fVar210 = fVar265 * fVar308;
  fVar321 = (2.0 - fVar294 * auVar70._0_4_) * auVar70._0_4_;
  fVar276 = fVar303 * fVar316 * fVar274;
  fVar288 = fVar303 * fVar306 * fVar274;
  fVar293 = fVar303 * fVar311 * fVar274;
  fVar305 = fVar303 * fVar212;
  fVar200 = fVar275 - fVar276;
  fVar211 = fVar286 - fVar288;
  fVar213 = fVar290 - fVar293;
  fVar214 = fVar303 - fVar305;
  fVar277 = fVar303 * fVar227 * (fVar196 * fVar231 - fVar304 * fVar316) * fVar274 +
            fVar161 * fVar316 * fVar274;
  fVar287 = fVar303 * fVar227 * (fVar196 * fVar250 - fVar304 * fVar306) * fVar274 +
            fVar161 * fVar306 * fVar274;
  fVar289 = fVar303 * fVar227 * (fVar196 * fVar215 - fVar304 * fVar311) * fVar274 +
            fVar161 * fVar311 * fVar274;
  fVar292 = fVar303 * fVar227 * (fVar196 * (fVar161 * fVar291 - fVar291 * fVar161) -
                                fVar304 * fVar319) * fVar274 + fVar161 * fVar212;
  fVar276 = fVar276 + fVar275;
  fVar288 = fVar288 + fVar286;
  fVar293 = fVar293 + fVar290;
  fVar305 = fVar305 + fVar303;
  fVar275 = fVar170 * fVar248 * fVar308;
  fVar286 = fVar170 * fVar249 * fVar308;
  fVar290 = fVar170 * fVar238 * fVar308;
  fVar303 = fVar170 * fVar210;
  fVar216 = fVar163 - fVar275;
  fVar228 = fVar167 - fVar286;
  fVar232 = fVar169 - fVar290;
  fVar235 = fVar170 - fVar303;
  fVar291 = fVar170 * fVar321 * (fVar294 * fVar263 - fVar320 * fVar248) * fVar308 +
            fVar317 * fVar248 * fVar308;
  fVar304 = fVar170 * fVar321 * (fVar294 * fVar309 - fVar320 * fVar249) * fVar308 +
            fVar317 * fVar249 * fVar308;
  fVar306 = fVar170 * fVar321 * (fVar294 * fVar262 - fVar320 * fVar238) * fVar308 +
            fVar317 * fVar238 * fVar308;
  fVar308 = fVar170 * fVar321 * (fVar294 * (fVar317 * fVar199 - fVar199 * fVar317) -
                                fVar320 * fVar265) * fVar308 + fVar317 * fVar210;
  fVar275 = fVar275 + fVar163;
  fVar286 = fVar286 + fVar167;
  fVar290 = fVar290 + fVar169;
  fVar303 = fVar303 + fVar170;
  fVar217 = fVar140 * 0.16666667 + fVar120 * 0.6666667 + fVar141 * 0.16666667 + fVar166 * 0.0;
  fVar229 = fVar69 * 0.16666667 + fVar121 * 0.6666667 + fVar157 * 0.16666667 + fVar168 * 0.0;
  fVar233 = fVar100 * 0.16666667 + fVar122 * 0.6666667 + fVar159 * 0.16666667 + fVar171 * 0.0;
  fVar236 = fVar101 * 0.16666667 + fVar139 * 0.6666667 + fVar162 * 0.16666667 + fVar195 * 0.0;
  fVar163 = ((fVar141 * 0.5 + fVar166 * 0.0) - fVar120 * 0.0) - fVar140 * 0.5;
  fVar167 = ((fVar157 * 0.5 + fVar168 * 0.0) - fVar121 * 0.0) - fVar69 * 0.5;
  fVar169 = ((fVar159 * 0.5 + fVar171 * 0.0) - fVar122 * 0.0) - fVar100 * 0.5;
  fVar170 = ((fVar162 * 0.5 + fVar195 * 0.0) - fVar139 * 0.0) - fVar101 * 0.5;
  pfVar3 = (float *)(lVar16 + lVar15 * lVar2);
  fVar196 = *pfVar3;
  fVar199 = pfVar3[1];
  fVar210 = pfVar3[2];
  fVar212 = pfVar3[3];
  pfVar3 = (float *)(lVar16 + lVar1 * lVar15);
  fVar215 = *pfVar3;
  fVar227 = pfVar3[1];
  fVar231 = pfVar3[2];
  fVar250 = pfVar3[3];
  pfVar3 = (float *)(lVar16 + uVar59);
  fVar262 = *pfVar3;
  fVar263 = pfVar3[1];
  fVar309 = pfVar3[2];
  fVar238 = pfVar3[3];
  pfVar3 = (float *)(lVar16 + uVar54 * lVar15);
  fVar248 = *pfVar3;
  fVar249 = pfVar3[1];
  fVar265 = pfVar3[2];
  fVar274 = pfVar3[3];
  fVar218 = fVar248 * 0.16666667 + fVar262 * 0.6666667 + fVar215 * 0.16666667 + fVar196 * 0.0;
  fVar230 = fVar249 * 0.16666667 + fVar263 * 0.6666667 + fVar227 * 0.16666667 + fVar199 * 0.0;
  fVar234 = fVar265 * 0.16666667 + fVar309 * 0.6666667 + fVar231 * 0.16666667 + fVar210 * 0.0;
  fVar237 = fVar274 * 0.16666667 + fVar238 * 0.6666667 + fVar250 * 0.16666667 + fVar212 * 0.0;
  fVar320 = ((fVar215 * 0.5 + fVar196 * 0.0) - fVar262 * 0.0) - fVar248 * 0.5;
  fVar321 = ((fVar227 * 0.5 + fVar199 * 0.0) - fVar263 * 0.0) - fVar249 * 0.5;
  fVar197 = ((fVar231 * 0.5 + fVar210 * 0.0) - fVar309 * 0.0) - fVar265 * 0.5;
  fVar198 = ((fVar250 * 0.5 + fVar212 * 0.0) - fVar238 * 0.0) - fVar274 * 0.5;
  fVar294 = fVar120 * 0.16666667 + fVar141 * 0.6666667 + fVar166 * 0.16666667 + fVar140 * 0.0;
  fVar311 = fVar121 * 0.16666667 + fVar157 * 0.6666667 + fVar168 * 0.16666667 + fVar69 * 0.0;
  fVar316 = fVar122 * 0.16666667 + fVar159 * 0.6666667 + fVar171 * 0.16666667 + fVar100 * 0.0;
  fVar319 = fVar139 * 0.16666667 + fVar162 * 0.6666667 + fVar195 * 0.16666667 + fVar101 * 0.0;
  fVar120 = ((fVar141 * 0.0 + fVar166 * 0.5) - fVar120 * 0.5) - fVar140 * 0.0;
  fVar141 = ((fVar157 * 0.0 + fVar168 * 0.5) - fVar121 * 0.5) - fVar69 * 0.0;
  fVar159 = ((fVar159 * 0.0 + fVar171 * 0.5) - fVar122 * 0.5) - fVar100 * 0.0;
  fVar166 = ((fVar162 * 0.0 + fVar195 * 0.5) - fVar139 * 0.5) - fVar101 * 0.0;
  fVar121 = fVar262 * 0.16666667 + fVar215 * 0.6666667 + fVar196 * 0.16666667 + fVar248 * 0.0;
  fVar122 = fVar263 * 0.16666667 + fVar227 * 0.6666667 + fVar199 * 0.16666667 + fVar249 * 0.0;
  fVar139 = fVar309 * 0.16666667 + fVar231 * 0.6666667 + fVar210 * 0.16666667 + fVar265 * 0.0;
  fVar264 = fVar238 * 0.16666667 + fVar250 * 0.6666667 + fVar212 * 0.16666667 + fVar274 * 0.0;
  fVar140 = ((fVar215 * 0.0 + fVar196 * 0.5) - fVar262 * 0.5) - fVar248 * 0.0;
  fVar69 = ((fVar227 * 0.0 + fVar199 * 0.5) - fVar263 * 0.5) - fVar249 * 0.0;
  fVar100 = ((fVar231 * 0.0 + fVar210 * 0.5) - fVar309 * 0.5) - fVar265 * 0.0;
  fVar157 = ((fVar250 * 0.0 + fVar212 * 0.5) - fVar238 * 0.5) - fVar274 * 0.0;
  fVar212 = fVar167 * fVar218 - fVar230 * fVar163;
  fVar199 = fVar169 * fVar230 - fVar234 * fVar167;
  fVar210 = fVar163 * fVar234 - fVar218 * fVar169;
  fVar215 = fVar170 * fVar237 - fVar237 * fVar170;
  fVar101 = fVar167 * fVar320 - fVar321 * fVar163;
  fVar168 = fVar169 * fVar321 - fVar197 * fVar167;
  fVar195 = fVar163 * fVar197 - fVar320 * fVar169;
  fVar162 = fVar141 * fVar121 - fVar122 * fVar120;
  fVar171 = fVar159 * fVar122 - fVar139 * fVar141;
  fVar196 = fVar120 * fVar139 - fVar121 * fVar159;
  fVar309 = fVar166 * fVar264 - fVar264 * fVar166;
  fVar121 = fVar141 * fVar140 - fVar69 * fVar120;
  fVar122 = fVar159 * fVar69 - fVar100 * fVar141;
  fVar139 = fVar120 * fVar100 - fVar140 * fVar159;
  fVar140 = fVar210 * fVar210 + fVar199 * fVar199 + fVar212 * fVar212;
  auVar70 = ZEXT416((uint)fVar140);
  auVar124 = rsqrtss(ZEXT416((uint)fVar140),auVar70);
  fVar69 = auVar124._0_4_;
  fVar263 = fVar69 * 1.5 - fVar69 * fVar69 * fVar140 * 0.5 * fVar69;
  fVar238 = fVar212 * fVar101 + fVar210 * fVar195 + fVar199 * fVar168;
  auVar70 = rcpss(auVar70,auVar70);
  fVar69 = (2.0 - fVar140 * auVar70._0_4_) * auVar70._0_4_;
  fVar100 = fVar215 * fVar263;
  fVar248 = fVar196 * fVar196 + fVar171 * fVar171 + fVar162 * fVar162;
  auVar70 = ZEXT416((uint)fVar248);
  auVar124 = rsqrtss(ZEXT416((uint)fVar248),auVar70);
  fVar227 = auVar124._0_4_;
  fVar265 = fVar227 * 1.5 - fVar227 * fVar227 * fVar248 * 0.5 * fVar227;
  fVar197 = fVar162 * fVar121 + fVar196 * fVar139 + fVar171 * fVar122;
  auVar70 = rcpss(auVar70,auVar70);
  fVar218 = (2.0 - fVar248 * auVar70._0_4_) * auVar70._0_4_;
  fVar249 = fVar309 * fVar265;
  fVar227 = fVar236 * fVar199 * fVar263;
  fVar231 = fVar236 * fVar210 * fVar263;
  fVar250 = fVar236 * fVar212 * fVar263;
  fVar262 = fVar236 * fVar100;
  fVar199 = fVar236 * fVar69 * (fVar140 * fVar168 - fVar238 * fVar199) * fVar263 +
            fVar170 * fVar199 * fVar263;
  fVar210 = fVar236 * fVar69 * (fVar140 * fVar195 - fVar238 * fVar210) * fVar263 +
            fVar170 * fVar210 * fVar263;
  fVar212 = fVar236 * fVar69 * (fVar140 * fVar101 - fVar238 * fVar212) * fVar263 +
            fVar170 * fVar212 * fVar263;
  fVar215 = fVar236 * fVar69 * (fVar140 * (fVar170 * fVar198 - fVar198 * fVar170) -
                               fVar238 * fVar215) * fVar263 + fVar170 * fVar100;
  fVar168 = fVar217 - fVar227;
  fVar195 = fVar229 - fVar231;
  fVar263 = fVar233 - fVar250;
  fVar238 = fVar236 - fVar262;
  fVar227 = fVar227 + fVar217;
  fVar231 = fVar231 + fVar229;
  fVar250 = fVar250 + fVar233;
  fVar262 = fVar262 + fVar236;
  fVar140 = fVar319 * fVar171 * fVar265;
  fVar69 = fVar319 * fVar196 * fVar265;
  fVar100 = fVar319 * fVar162 * fVar265;
  fVar101 = fVar319 * fVar249;
  fVar274 = fVar319 * fVar218 * (fVar248 * fVar122 - fVar197 * fVar171) * fVar265 +
            fVar166 * fVar171 * fVar265;
  fVar320 = fVar319 * fVar218 * (fVar248 * fVar139 - fVar197 * fVar196) * fVar265 +
            fVar166 * fVar196 * fVar265;
  fVar321 = fVar319 * fVar218 * (fVar248 * fVar121 - fVar197 * fVar162) * fVar265 +
            fVar166 * fVar162 * fVar265;
  fVar197 = fVar319 * fVar218 * (fVar248 * (fVar166 * fVar157 - fVar157 * fVar166) -
                                fVar197 * fVar309) * fVar265 + fVar166 * fVar249;
  fVar121 = fVar294 - fVar140;
  fVar122 = fVar311 - fVar69;
  fVar139 = fVar316 - fVar100;
  fVar157 = fVar319 - fVar101;
  fVar140 = fVar140 + fVar294;
  fVar69 = fVar69 + fVar311;
  fVar100 = fVar100 + fVar316;
  fVar101 = fVar101 + fVar319;
  fVar294 = 1.0 - fVar99;
  fVar311 = fVar200 * fVar294 + fVar168 * fVar99;
  fVar316 = fVar211 * fVar294 + fVar195 * fVar99;
  fVar319 = fVar213 * fVar294 + fVar263 * fVar99;
  fVar198 = fVar214 * fVar294 + fVar238 * fVar99;
  fVar200 = ((fVar318 - fVar277) * 0.33333334 + fVar200) * fVar294 +
            ((fVar163 - fVar199) * 0.33333334 + fVar168) * fVar99;
  fVar211 = ((fVar158 - fVar287) * 0.33333334 + fVar211) * fVar294 +
            ((fVar167 - fVar210) * 0.33333334 + fVar195) * fVar99;
  fVar213 = ((fVar160 - fVar289) * 0.33333334 + fVar213) * fVar294 +
            ((fVar169 - fVar212) * 0.33333334 + fVar263) * fVar99;
  fVar214 = ((fVar161 - fVar292) * 0.33333334 + fVar214) * fVar294 +
            ((fVar170 - fVar215) * 0.33333334 + fVar238) * fVar99;
  fVar263 = (fVar216 - (fVar307 - fVar291) * 0.33333334) * fVar294 +
            (fVar121 - (fVar120 - fVar274) * 0.33333334) * fVar99;
  fVar309 = (fVar228 - (fVar310 - fVar304) * 0.33333334) * fVar294 +
            (fVar122 - (fVar141 - fVar320) * 0.33333334) * fVar99;
  fVar238 = (fVar232 - (fVar315 - fVar306) * 0.33333334) * fVar294 +
            (fVar139 - (fVar159 - fVar321) * 0.33333334) * fVar99;
  fVar248 = (fVar235 - (fVar317 - fVar308) * 0.33333334) * fVar294 +
            (fVar157 - (fVar166 - fVar197) * 0.33333334) * fVar99;
  fVar168 = fVar216 * fVar294 + fVar121 * fVar99;
  fVar171 = fVar228 * fVar294 + fVar122 * fVar99;
  fVar195 = fVar232 * fVar294 + fVar139 * fVar99;
  fVar196 = fVar235 * fVar294 + fVar157 * fVar99;
  fVar121 = fVar276 * fVar294 + fVar227 * fVar99;
  fVar139 = fVar288 * fVar294 + fVar231 * fVar99;
  fVar157 = fVar293 * fVar294 + fVar250 * fVar99;
  fVar162 = fVar305 * fVar294 + fVar262 * fVar99;
  fVar249 = ((fVar277 + fVar318) * 0.33333334 + fVar276) * fVar294 +
            ((fVar199 + fVar163) * 0.33333334 + fVar227) * fVar99;
  fVar265 = ((fVar287 + fVar158) * 0.33333334 + fVar288) * fVar294 +
            ((fVar210 + fVar167) * 0.33333334 + fVar231) * fVar99;
  fVar250 = ((fVar289 + fVar160) * 0.33333334 + fVar293) * fVar294 +
            ((fVar212 + fVar169) * 0.33333334 + fVar250) * fVar99;
  fVar262 = ((fVar292 + fVar161) * 0.33333334 + fVar305) * fVar294 +
            ((fVar215 + fVar170) * 0.33333334 + fVar262) * fVar99;
  fVar122 = (fVar275 - (fVar291 + fVar307) * 0.33333334) * fVar294 +
            (fVar140 - (fVar274 + fVar120) * 0.33333334) * fVar99;
  fVar141 = (fVar286 - (fVar304 + fVar310) * 0.33333334) * fVar294 +
            (fVar69 - (fVar320 + fVar141) * 0.33333334) * fVar99;
  fVar159 = (fVar290 - (fVar306 + fVar315) * 0.33333334) * fVar294 +
            (fVar100 - (fVar321 + fVar159) * 0.33333334) * fVar99;
  fVar166 = (fVar303 - (fVar308 + fVar317) * 0.33333334) * fVar294 +
            (fVar101 - (fVar197 + fVar166) * 0.33333334) * fVar99;
  local_288 = fVar294 * fVar275 + fVar99 * fVar140;
  fStack_284 = fVar294 * fVar286 + fVar99 * fVar69;
  fStack_280 = fVar294 * fVar290 + fVar99 * fVar100;
  fStack_27c = fVar294 * fVar303 + fVar99 * fVar101;
  local_1c8 = *(float *)(ray + k * 4);
  fStack_1c4 = *(float *)(ray + k * 4 + 0x10);
  fStack_1c0 = *(float *)(ray + k * 4 + 0x20);
  local_158 = fVar311 - local_1c8;
  fStack_154 = fVar316 - fStack_1c4;
  fStack_150 = fVar319 - fStack_1c0;
  fStack_14c = fVar198 - 0.0;
  fVar140 = pre->ray_space[k].vx.field_0.m128[0];
  fVar69 = pre->ray_space[k].vx.field_0.m128[1];
  fVar99 = pre->ray_space[k].vy.field_0.m128[0];
  fVar100 = pre->ray_space[k].vy.field_0.m128[1];
  fVar101 = pre->ray_space[k].vz.field_0.m128[0];
  fVar120 = pre->ray_space[k].vz.field_0.m128[1];
  fVar199 = local_158 * fVar140 + fStack_154 * fVar99 + fStack_150 * fVar101;
  fVar212 = local_158 * fVar69 + fStack_154 * fVar100 + fStack_150 * fVar120;
  local_168 = fVar200 - local_1c8;
  fStack_164 = fVar211 - fStack_1c4;
  fStack_160 = fVar213 - fStack_1c0;
  fStack_15c = fVar214 - 0.0;
  fVar293 = local_168 * fVar140 + fStack_164 * fVar99 + fStack_160 * fVar101;
  fVar303 = local_168 * fVar69 + fStack_164 * fVar100 + fStack_160 * fVar120;
  local_348 = CONCAT44(fVar303,fVar293);
  local_178 = fVar263 - local_1c8;
  fStack_174 = fVar309 - fStack_1c4;
  fStack_170 = fVar238 - fStack_1c0;
  fStack_16c = fVar248 - 0.0;
  fVar227 = local_178 * fVar140 + fStack_174 * fVar99 + fStack_170 * fVar101;
  fVar231 = local_178 * fVar69 + fStack_174 * fVar100 + fStack_170 * fVar120;
  local_358 = CONCAT44(fVar231,fVar227);
  local_188 = fVar168 - local_1c8;
  fStack_184 = fVar171 - fStack_1c4;
  fStack_180 = fVar195 - fStack_1c0;
  fStack_17c = fVar196 - 0.0;
  fVar210 = local_188 * fVar140 + fStack_184 * fVar99 + fStack_180 * fVar101;
  fVar215 = local_188 * fVar69 + fStack_184 * fVar100 + fStack_180 * fVar120;
  local_368 = CONCAT44(fVar215,fVar210);
  local_198 = fVar121 - local_1c8;
  fStack_194 = fVar139 - fStack_1c4;
  fStack_190 = fVar157 - fStack_1c0;
  fStack_18c = fVar162 - 0.0;
  fVar274 = local_198 * fVar140 + fStack_194 * fVar99 + fStack_190 * fVar101;
  fVar275 = local_198 * fVar69 + fStack_194 * fVar100 + fStack_190 * fVar120;
  local_378 = CONCAT44(fVar275,fVar274);
  local_1a8 = fVar249 - local_1c8;
  fStack_1a4 = fVar265 - fStack_1c4;
  fStack_1a0 = fVar250 - fStack_1c0;
  fStack_19c = fVar262 - 0.0;
  fVar276 = local_1a8 * fVar140 + fStack_1a4 * fVar99 + fStack_1a0 * fVar101;
  fVar286 = local_1a8 * fVar69 + fStack_1a4 * fVar100 + fStack_1a0 * fVar120;
  local_388 = CONCAT44(fVar286,fVar276);
  local_1b8 = fVar122 - local_1c8;
  fStack_1b4 = fVar141 - fStack_1c4;
  fStack_1b0 = fVar159 - fStack_1c0;
  fStack_1ac = fVar166 - 0.0;
  fVar288 = local_1b8 * fVar140 + fStack_1b4 * fVar99 + fStack_1b0 * fVar101;
  fVar290 = local_1b8 * fVar69 + fStack_1b4 * fVar100 + fStack_1b0 * fVar120;
  local_398 = CONCAT44(fVar290,fVar288);
  local_1c8 = local_288 - local_1c8;
  fStack_1c4 = fStack_284 - fStack_1c4;
  fStack_1c0 = fStack_280 - fStack_1c0;
  fStack_1bc = fStack_27c - 0.0;
  fVar99 = local_1c8 * fVar140 + fStack_1c4 * fVar99 + fStack_1c0 * fVar101;
  fVar69 = local_1c8 * fVar69 + fStack_1c4 * fVar100 + fStack_1c0 * fVar120;
  local_3a8 = CONCAT44(fVar69,fVar99);
  auVar188._8_8_ = local_388;
  auVar188._0_8_ = local_348;
  register0x00001488 = local_3a8;
  local_148 = local_368;
  auVar90._8_4_ = fVar274;
  auVar90._0_8_ = CONCAT44(fVar212,fVar199);
  auVar90._12_4_ = fVar275;
  auVar70 = minps(auVar90,auVar188);
  auVar113._8_4_ = fVar288;
  auVar113._0_8_ = local_358;
  auVar113._12_4_ = fVar290;
  auVar124 = minps(auVar113,_local_148);
  auVar70 = minps(auVar70,auVar124);
  auVar114._8_4_ = fVar274;
  auVar114._0_8_ = CONCAT44(fVar212,fVar199);
  auVar114._12_4_ = fVar275;
  auVar124 = maxps(auVar114,auVar188);
  auVar125._4_4_ = fVar231;
  auVar125._0_4_ = fVar227;
  auVar125._8_4_ = fVar288;
  auVar125._12_4_ = fVar290;
  auVar126 = maxps(auVar125,_local_148);
  auVar255 = maxps(auVar124,auVar126);
  auVar19._4_8_ = auVar126._8_8_;
  auVar19._0_4_ = auVar70._4_4_;
  auVar127._0_8_ = auVar19._0_8_ << 0x20;
  auVar127._8_4_ = auVar70._8_4_;
  auVar127._12_4_ = auVar70._12_4_;
  auVar128._8_8_ = auVar70._8_8_;
  auVar128._0_8_ = auVar127._8_8_;
  auVar124 = minps(auVar70,auVar128);
  auVar20._4_8_ = auVar70._8_8_;
  auVar20._0_4_ = auVar255._4_4_;
  auVar129._0_8_ = auVar20._0_8_ << 0x20;
  auVar129._8_4_ = auVar255._8_4_;
  auVar129._12_4_ = auVar255._12_4_;
  auVar130._8_8_ = auVar255._8_8_;
  auVar130._0_8_ = auVar129._8_8_;
  auVar70 = maxps(auVar255,auVar130);
  auVar91._0_8_ = auVar124._0_8_ & 0x7fffffff7fffffff;
  auVar91._8_4_ = auVar124._8_4_ & 0x7fffffff;
  auVar91._12_4_ = auVar124._12_4_ & 0x7fffffff;
  auVar115._0_8_ = auVar70._0_8_ & 0x7fffffff7fffffff;
  auVar115._8_4_ = auVar70._8_4_ & 0x7fffffff;
  auVar115._12_4_ = auVar70._12_4_ & 0x7fffffff;
  auVar70 = maxps(auVar91,auVar115);
  fVar140 = auVar70._4_4_;
  if (auVar70._4_4_ <= auVar70._0_4_) {
    fVar140 = auVar70._0_4_;
  }
  local_3e8 = local_3e0 + 0xf;
  fVar140 = fVar140 * 9.536743e-07;
  local_258 = fVar140;
  fStack_254 = fVar140;
  fStack_250 = fVar140;
  fStack_24c = fVar140;
  local_268 = -fVar140;
  fStack_264 = -fVar140;
  fStack_260 = -fVar140;
  fStack_25c = -fVar140;
  local_118 = fVar293 - fVar199;
  fStack_114 = fVar303 - fVar212;
  fStack_110 = fVar276 - fVar274;
  fStack_10c = fVar286 - fVar275;
  local_128 = fVar227 - fVar293;
  fStack_124 = fVar231 - fVar303;
  fStack_120 = fVar288 - fVar276;
  fStack_11c = fVar290 - fVar286;
  local_138 = fVar210 - fVar227;
  fStack_134 = fVar215 - fVar231;
  fStack_130 = fVar99 - fVar288;
  fStack_12c = fVar69 - fVar290;
  local_2a8 = fVar121 - fVar311;
  fStack_2a4 = fVar139 - fVar316;
  fStack_2a0 = fVar157 - fVar319;
  fStack_29c = fVar162 - fVar198;
  local_2b8 = fVar249 - fVar200;
  fStack_2b4 = fVar265 - fVar211;
  fStack_2b0 = fVar250 - fVar213;
  fStack_2ac = fVar262 - fVar214;
  local_2c8 = fVar122 - fVar263;
  fStack_2c4 = fVar141 - fVar309;
  fStack_2c0 = fVar159 - fVar238;
  fStack_2bc = fVar166 - fVar248;
  local_2d8 = local_288 - fVar168;
  fStack_2d4 = fStack_284 - fVar171;
  fStack_2d0 = fStack_280 - fVar195;
  fStack_2cc = fStack_27c - fVar196;
  local_2e8 = uVar63;
  uStack_2e4 = uVar63;
  uStack_2e0 = uVar63;
  uStack_2dc = uVar63;
  local_2f8 = uVar64;
  uStack_2f4 = uVar64;
  uStack_2f0 = uVar64;
  uStack_2ec = uVar64;
  local_54c = 0;
  uVar64 = 0;
  fVar69 = *(float *)(ray + k * 4 + 0x30);
  local_548 = 0x3f80000000000000;
  local_518 = 0x3f80000000000000;
  local_3f0 = (ulong)uVar63;
  uStack_3a0 = local_3a8;
  uStack_390 = local_398;
  uStack_380 = local_388;
  uStack_370 = local_378;
  uStack_360 = local_368;
  uStack_350 = local_358;
  uStack_340 = local_348;
  do {
    fVar99 = 1.0 - (float)local_548;
    fVar100 = 1.0 - (float)local_548;
    fVar101 = 1.0 - local_548._4_4_;
    fVar120 = 1.0 - local_548._4_4_;
    fVar162 = fVar199 * fVar99 + (float)local_378 * (float)local_548;
    fVar248 = fVar212 * fVar100 + local_378._4_4_ * (float)local_548;
    fVar307 = fVar199 * fVar101 + (float)uStack_370 * local_548._4_4_;
    fVar317 = fVar212 * fVar120 + uStack_370._4_4_ * local_548._4_4_;
    fVar227 = (float)local_348 * fVar99 + (float)local_388 * (float)local_548;
    fVar310 = local_348._4_4_ * fVar100 + local_388._4_4_ * (float)local_548;
    fVar304 = (float)uStack_340 * fVar101 + (float)uStack_380 * local_548._4_4_;
    fVar167 = uStack_340._4_4_ * fVar120 + uStack_380._4_4_ * local_548._4_4_;
    fVar163 = (float)local_358 * fVar99 + (float)local_398 * (float)local_548;
    fVar158 = local_358._4_4_ * fVar100 + local_398._4_4_ * (float)local_548;
    fVar160 = (float)uStack_350 * fVar101 + (float)uStack_390 * local_548._4_4_;
    fVar161 = uStack_350._4_4_ * fVar120 + uStack_390._4_4_ * local_548._4_4_;
    fVar306 = fVar99 * (float)local_368 + (float)local_548 * (float)local_3a8;
    fVar169 = fVar100 * local_368._4_4_ + (float)local_548 * local_3a8._4_4_;
    fVar216 = fVar101 * (float)uStack_360 + local_548._4_4_ * (float)uStack_3a0;
    fVar217 = fVar120 * uStack_360._4_4_ + local_548._4_4_ * uStack_3a0._4_4_;
    fVar99 = (local_518._4_4_ - (float)local_518) * 0.11111111;
    fVar308 = (local_518._4_4_ - (float)local_518) * 0.0 + (float)local_518;
    fVar170 = (local_518._4_4_ - (float)local_518) * 0.33333334 + (float)local_518;
    fVar294 = (local_518._4_4_ - (float)local_518) * 0.6666667 + (float)local_518;
    fVar320 = (local_518._4_4_ - (float)local_518) * 1.0 + (float)local_518;
    fVar321 = 1.0 - fVar308;
    fVar197 = 1.0 - fVar170;
    fVar198 = 1.0 - fVar294;
    fVar214 = 1.0 - fVar320;
    fVar166 = fVar227 * fVar321 + fVar163 * fVar308;
    fVar196 = fVar227 * fVar197 + fVar163 * fVar170;
    fVar210 = fVar227 * fVar198 + fVar163 * fVar294;
    fVar215 = fVar227 * fVar214 + fVar163 * fVar320;
    fVar305 = fVar310 * fVar321 + fVar158 * fVar308;
    fVar315 = fVar310 * fVar197 + fVar158 * fVar170;
    fVar318 = fVar310 * fVar198 + fVar158 * fVar294;
    fVar291 = fVar310 * fVar214 + fVar158 * fVar320;
    fVar100 = (fVar162 * fVar321 + fVar227 * fVar308) * fVar321 + fVar308 * fVar166;
    fVar101 = (fVar162 * fVar197 + fVar227 * fVar170) * fVar197 + fVar170 * fVar196;
    fVar120 = (fVar162 * fVar198 + fVar227 * fVar294) * fVar198 + fVar294 * fVar210;
    fVar162 = (fVar162 * fVar214 + fVar227 * fVar320) * fVar214 + fVar320 * fVar215;
    fVar227 = (fVar248 * fVar321 + fVar310 * fVar308) * fVar321 + fVar308 * fVar305;
    fVar231 = (fVar248 * fVar197 + fVar310 * fVar170) * fVar197 + fVar170 * fVar315;
    fVar262 = (fVar248 * fVar198 + fVar310 * fVar294) * fVar198 + fVar294 * fVar318;
    fVar248 = (fVar248 * fVar214 + fVar310 * fVar320) * fVar214 + fVar320 * fVar291;
    fVar166 = fVar166 * fVar321 + (fVar163 * fVar321 + fVar306 * fVar308) * fVar308;
    fVar196 = fVar196 * fVar197 + (fVar163 * fVar197 + fVar306 * fVar170) * fVar170;
    fVar210 = fVar210 * fVar198 + (fVar163 * fVar198 + fVar306 * fVar294) * fVar294;
    fVar215 = fVar215 * fVar214 + (fVar163 * fVar214 + fVar306 * fVar320) * fVar320;
    fVar310 = fVar305 * fVar321 + (fVar158 * fVar321 + fVar169 * fVar308) * fVar308;
    fVar305 = fVar315 * fVar197 + (fVar158 * fVar197 + fVar169 * fVar170) * fVar170;
    fVar315 = fVar318 * fVar198 + (fVar158 * fVar198 + fVar169 * fVar294) * fVar294;
    fVar318 = fVar291 * fVar214 + (fVar158 * fVar214 + fVar169 * fVar320) * fVar320;
    local_3d8 = fVar321 * fVar100 + fVar308 * fVar166;
    fStack_3d4 = fVar197 * fVar101 + fVar170 * fVar196;
    fStack_3d0 = fVar198 * fVar120 + fVar294 * fVar210;
    fStack_3cc = fVar214 * fVar162 + fVar320 * fVar215;
    local_3c8 = fVar321 * fVar227 + fVar308 * fVar310;
    fStack_3c4 = fVar197 * fVar231 + fVar170 * fVar305;
    fStack_3c0 = fVar198 * fVar262 + fVar294 * fVar315;
    fStack_3bc = fVar214 * fVar248 + fVar320 * fVar318;
    fVar196 = (fVar196 - fVar101) * 3.0 * fVar99;
    fVar120 = (fVar210 - fVar120) * 3.0 * fVar99;
    fVar162 = (fVar215 - fVar162) * 3.0 * fVar99;
    fVar215 = (fVar305 - fVar231) * 3.0 * fVar99;
    fVar315 = (fVar315 - fVar262) * 3.0 * fVar99;
    fVar248 = (fVar318 - fVar248) * 3.0 * fVar99;
    local_1f8._4_4_ = fStack_3d0;
    local_1f8._0_4_ = fStack_3d4;
    local_1d8._4_4_ = fStack_3c0;
    local_1d8._0_4_ = fStack_3c4;
    fVar210 = local_3d8 + (fVar166 - fVar100) * 3.0 * fVar99;
    fVar231 = fStack_3d4 + fVar196;
    fVar262 = fStack_3d0 + fVar120;
    fVar305 = fStack_3cc + fVar162;
    fVar100 = local_3c8 + (fVar310 - fVar227) * 3.0 * fVar99;
    fVar101 = fStack_3c4 + fVar215;
    fStack_520 = fStack_3c0 + fVar315;
    fStack_51c = fStack_3bc + fVar248;
    local_3b8._0_4_ = fStack_3d4 - fVar196;
    local_3b8._4_4_ = fStack_3d0 - fVar120;
    local_3b8._8_4_ = fStack_3cc - fVar162;
    local_3b8._12_4_ = 0;
    local_1d8._8_4_ = fStack_3bc;
    local_1d8._12_4_ = 0;
    local_1e8._0_4_ = fStack_3c4 - fVar215;
    local_1e8._4_4_ = fStack_3c0 - fVar315;
    local_1e8._8_4_ = fStack_3bc - fVar248;
    local_1e8._12_4_ = 0;
    fVar120 = fVar304 * fVar321 + fVar160 * fVar308;
    fVar162 = fVar304 * fVar197 + fVar160 * fVar170;
    fVar166 = fVar304 * fVar198 + fVar160 * fVar294;
    fVar196 = fVar304 * fVar214 + fVar160 * fVar320;
    fVar215 = fVar167 * fVar321 + fVar161 * fVar308;
    fVar227 = fVar167 * fVar197 + fVar161 * fVar170;
    fVar248 = fVar167 * fVar198 + fVar161 * fVar294;
    fVar169 = fVar167 * fVar214 + fVar161 * fVar320;
    fVar291 = (fVar307 * fVar321 + fVar304 * fVar308) * fVar321 + fVar308 * fVar120;
    fVar163 = (fVar307 * fVar197 + fVar304 * fVar170) * fVar197 + fVar170 * fVar162;
    fVar158 = (fVar307 * fVar198 + fVar304 * fVar294) * fVar198 + fVar294 * fVar166;
    fVar304 = (fVar307 * fVar214 + fVar304 * fVar320) * fVar214 + fVar320 * fVar196;
    fVar318 = (fVar317 * fVar321 + fVar167 * fVar308) * fVar321 + fVar308 * fVar215;
    fVar310 = (fVar317 * fVar197 + fVar167 * fVar170) * fVar197 + fVar170 * fVar227;
    fVar315 = (fVar317 * fVar198 + fVar167 * fVar294) * fVar198 + fVar294 * fVar248;
    fVar317 = (fVar317 * fVar214 + fVar167 * fVar320) * fVar214 + fVar320 * fVar169;
    fVar120 = fVar120 * fVar321 + (fVar160 * fVar321 + fVar216 * fVar308) * fVar308;
    fVar162 = fVar162 * fVar197 + (fVar160 * fVar197 + fVar216 * fVar170) * fVar170;
    fVar166 = fVar166 * fVar198 + (fVar160 * fVar198 + fVar216 * fVar294) * fVar294;
    fVar196 = fVar196 * fVar214 + (fVar160 * fVar214 + fVar216 * fVar320) * fVar320;
    fVar167 = fVar215 * fVar321 + (fVar161 * fVar321 + fVar217 * fVar308) * fVar308;
    fVar160 = fVar227 * fVar197 + (fVar161 * fVar197 + fVar217 * fVar170) * fVar170;
    fVar306 = fVar248 * fVar198 + (fVar161 * fVar198 + fVar217 * fVar294) * fVar294;
    fVar169 = fVar169 * fVar214 + (fVar161 * fVar214 + fVar217 * fVar320) * fVar320;
    fVar215 = fVar321 * fVar291 + fVar308 * fVar120;
    fVar227 = fVar197 * fVar163 + fVar170 * fVar162;
    fVar248 = fVar198 * fVar158 + fVar294 * fVar166;
    fVar307 = fVar214 * fVar304 + fVar320 * fVar196;
    fVar161 = fVar321 * fVar318 + fVar308 * fVar167;
    fVar308 = fVar197 * fVar310 + fVar170 * fVar160;
    fVar170 = fVar198 * fVar315 + fVar294 * fVar306;
    fVar294 = fVar214 * fVar317 + fVar320 * fVar169;
    fVar162 = (fVar162 - fVar163) * 3.0 * fVar99;
    fVar166 = (fVar166 - fVar158) * 3.0 * fVar99;
    fVar196 = (fVar196 - fVar304) * 3.0 * fVar99;
    fVar163 = (fVar160 - fVar310) * 3.0 * fVar99;
    fVar158 = (fVar306 - fVar315) * 3.0 * fVar99;
    fVar304 = (fVar169 - fVar317) * 3.0 * fVar99;
    local_208._4_4_ = fVar248;
    local_208._0_4_ = fVar227;
    local_208._8_4_ = fVar307;
    local_208._12_4_ = 0;
    local_228._4_4_ = fVar170;
    local_228._0_4_ = fVar308;
    local_228._8_4_ = fVar294;
    local_228._12_4_ = 0;
    fVar120 = fVar215 + (fVar120 - fVar291) * 3.0 * fVar99;
    fVar310 = fVar227 + fVar162;
    fVar315 = fVar248 + fVar166;
    fVar317 = fVar307 + fVar196;
    local_218 = fVar161 + (fVar167 - fVar318) * 3.0 * fVar99;
    fStack_214 = fVar308 + fVar163;
    fStack_210 = fVar170 + fVar158;
    fStack_20c = fVar294 + fVar304;
    local_248._0_4_ = fVar227 - fVar162;
    local_248._4_4_ = fVar248 - fVar166;
    local_248._8_4_ = fVar307 - fVar196;
    local_248._12_4_ = 0;
    local_238._0_4_ = fVar308 - fVar163;
    local_238._4_4_ = fVar170 - fVar158;
    local_238._8_4_ = fVar294 - fVar304;
    local_238._12_4_ = 0;
    local_1f8._8_4_ = fStack_3cc;
    local_1f8._12_4_ = 0;
    fVar318 = (fVar227 - fStack_3d4) + (fVar215 - local_3d8);
    fVar291 = (fVar248 - fStack_3d0) + (fVar227 - fStack_3d4);
    fVar163 = (fVar307 - fStack_3cc) + (fVar248 - fStack_3d0);
    fVar158 = (fVar307 - fStack_3cc) + 0.0;
    fVar99 = (fVar308 - fStack_3c4) + (fVar161 - local_3c8);
    fVar162 = (fVar170 - fStack_3c0) + (fVar308 - fStack_3c4);
    fVar166 = (fVar294 - fStack_3bc) + (fVar170 - fStack_3c0);
    fVar196 = (fVar294 - fStack_3bc) + 0.0;
    auVar189._0_8_ =
         CONCAT44(fStack_3c4 * fVar291 - fStack_3d4 * fVar162,
                  local_3c8 * fVar318 - local_3d8 * fVar99);
    auVar189._8_4_ = fStack_3c0 * fVar163 - fStack_3d0 * fVar166;
    auVar189._12_4_ = fStack_3bc * fVar158 - fStack_3cc * fVar196;
    auVar131._0_4_ = fVar100 * fVar318 - fVar210 * fVar99;
    auVar131._4_4_ = fVar101 * fVar291 - fVar231 * fVar162;
    auVar131._8_4_ = fStack_520 * fVar163 - fVar262 * fVar166;
    auVar131._12_4_ = fStack_51c * fVar158 - fVar305 * fVar196;
    auVar147._0_8_ =
         CONCAT44(local_1e8._4_4_ * fVar291 - fVar162 * local_3b8._4_4_,
                  local_1e8._0_4_ * fVar318 - fVar99 * local_3b8._0_4_);
    auVar147._8_4_ = local_1e8._8_4_ * fVar163 - fVar166 * local_3b8._8_4_;
    auVar147._12_4_ = fVar158 * 0.0 - fVar196 * 0.0;
    auVar327._0_4_ = fVar318 * fStack_3c4 - fVar99 * fStack_3d4;
    auVar327._4_4_ = fVar291 * fStack_3c0 - fVar162 * fStack_3d0;
    auVar327._8_4_ = fVar163 * fStack_3bc - fVar166 * fStack_3cc;
    auVar327._12_4_ = fVar158 * 0.0 - fVar196 * 0.0;
    auVar92._0_8_ =
         CONCAT44(fVar308 * fVar291 - fVar227 * fVar162,fVar161 * fVar318 - fVar215 * fVar99);
    auVar92._8_4_ = fVar170 * fVar163 - fVar248 * fVar166;
    auVar92._12_4_ = fVar294 * fVar158 - fVar307 * fVar196;
    auVar283._0_4_ = local_218 * fVar318 - fVar120 * fVar99;
    auVar283._4_4_ = fStack_214 * fVar291 - fVar310 * fVar162;
    auVar283._8_4_ = fStack_210 * fVar163 - fVar315 * fVar166;
    auVar283._12_4_ = fStack_20c * fVar158 - fVar317 * fVar196;
    auVar239._0_8_ =
         CONCAT44(local_238._4_4_ * fVar291 - fVar162 * local_248._4_4_,
                  local_238._0_4_ * fVar318 - fVar99 * local_248._0_4_);
    auVar239._8_4_ = local_238._8_4_ * fVar163 - fVar166 * local_248._8_4_;
    auVar239._12_4_ = fVar158 * 0.0 - fVar196 * 0.0;
    auVar270._0_4_ = fVar318 * fVar308 - fVar99 * fVar227;
    auVar270._4_4_ = fVar291 * fVar170 - fVar162 * fVar248;
    auVar270._8_4_ = fVar163 * fVar294 - fVar166 * fVar307;
    auVar270._12_4_ = fVar158 * 0.0 - fVar196 * 0.0;
    auVar322._8_4_ = auVar189._8_4_;
    auVar322._0_8_ = auVar189._0_8_;
    auVar322._12_4_ = auVar189._12_4_;
    auVar255 = minps(auVar322,auVar131);
    auVar124 = maxps(auVar189,auVar131);
    auVar132._8_4_ = auVar147._8_4_;
    auVar132._0_8_ = auVar147._0_8_;
    auVar132._12_4_ = auVar147._12_4_;
    auVar70 = minps(auVar132,auVar327);
    auVar323 = minps(auVar255,auVar70);
    auVar70 = maxps(auVar147,auVar327);
    auVar126 = maxps(auVar124,auVar70);
    auVar133._8_4_ = auVar92._8_4_;
    auVar133._0_8_ = auVar92._0_8_;
    auVar133._12_4_ = auVar92._12_4_;
    auVar124 = minps(auVar133,auVar283);
    auVar70 = maxps(auVar92,auVar283);
    auVar148._8_4_ = auVar239._8_4_;
    auVar148._0_8_ = auVar239._0_8_;
    auVar148._12_4_ = auVar239._12_4_;
    auVar255 = minps(auVar148,auVar270);
    auVar124 = minps(auVar124,auVar255);
    auVar255 = minps(auVar323,auVar124);
    auVar124 = maxps(auVar239,auVar270);
    auVar70 = maxps(auVar70,auVar124);
    auVar70 = maxps(auVar126,auVar70);
    auVar190._0_4_ =
         -(uint)(local_268 <= auVar70._0_4_ && auVar255._0_4_ <= local_258) & local_278._0_4_;
    auVar190._4_4_ =
         -(uint)(fStack_264 <= auVar70._4_4_ && auVar255._4_4_ <= fStack_254) & local_278._4_4_;
    auVar190._8_4_ =
         -(uint)(fStack_260 <= auVar70._8_4_ && auVar255._8_4_ <= fStack_250) & local_278._8_4_;
    auVar190._12_4_ =
         -(uint)(fStack_25c <= auVar70._12_4_ && auVar255._12_4_ <= fStack_24c) & local_278._12_4_;
    iVar58 = movmskps((int)uVar59,auVar190);
    uVar54 = 0;
    if (iVar58 != 0) {
      fVar318 = (fVar227 - fVar215) + (fStack_3d4 - local_3d8);
      fVar291 = (fVar248 - fVar227) + (fStack_3d0 - fStack_3d4);
      fVar163 = (fVar307 - fVar248) + (fStack_3cc - fStack_3d0);
      fVar158 = (0.0 - fVar307) + (0.0 - fStack_3cc);
      fVar99 = (fVar308 - fVar161) + (fStack_3c4 - local_3c8);
      fVar162 = (fVar170 - fVar308) + (fStack_3c0 - fStack_3c4);
      fVar166 = (fVar294 - fVar170) + (fStack_3bc - fStack_3c0);
      fVar196 = (0.0 - fVar294) + (0.0 - fStack_3bc);
      auVar328._0_8_ =
           CONCAT44(fStack_3c4 * fVar291 - fStack_3d4 * fVar162,
                    local_3c8 * fVar318 - local_3d8 * fVar99);
      auVar328._8_4_ = fStack_3c0 * fVar163 - fStack_3d0 * fVar166;
      auVar328._12_4_ = fStack_3bc * fVar158 - fStack_3cc * fVar196;
      auVar134._0_4_ = fVar100 * fVar318 - fVar210 * fVar99;
      auVar134._4_4_ = fVar101 * fVar291 - fVar231 * fVar162;
      auVar134._8_4_ = fStack_520 * fVar163 - fVar262 * fVar166;
      auVar134._12_4_ = fStack_51c * fVar158 - fVar305 * fVar196;
      auVar224._0_8_ =
           CONCAT44(local_1e8._4_4_ * fVar291 - local_3b8._4_4_ * fVar162,
                    local_1e8._0_4_ * fVar318 - local_3b8._0_4_ * fVar99);
      auVar224._8_4_ = local_1e8._8_4_ * fVar163 - local_3b8._8_4_ * fVar166;
      auVar224._12_4_ = fVar158 * 0.0 - fVar196 * 0.0;
      auVar149._0_4_ = fStack_3c4 * fVar318 - fStack_3d4 * fVar99;
      auVar149._4_4_ = fStack_3c0 * fVar291 - fStack_3d0 * fVar162;
      auVar149._8_4_ = fStack_3bc * fVar163 - fStack_3cc * fVar166;
      auVar149._12_4_ = fVar158 * 0.0 - fVar196 * 0.0;
      auVar312._0_8_ =
           CONCAT44(fVar308 * fVar291 - fVar227 * fVar162,fVar161 * fVar318 - fVar215 * fVar99);
      auVar312._8_4_ = fVar170 * fVar163 - fVar248 * fVar166;
      auVar312._12_4_ = fVar294 * fVar158 - fVar307 * fVar196;
      auVar164._0_4_ = local_218 * fVar318 - fVar120 * fVar99;
      auVar164._4_4_ = fStack_214 * fVar291 - fVar310 * fVar162;
      auVar164._8_4_ = fStack_210 * fVar163 - fVar315 * fVar166;
      auVar164._12_4_ = fStack_20c * fVar158 - fVar317 * fVar196;
      auVar284._0_8_ =
           CONCAT44(local_238._4_4_ * fVar291 - local_248._4_4_ * fVar162,
                    local_238._0_4_ * fVar318 - local_248._0_4_ * fVar99);
      auVar284._8_4_ = local_238._8_4_ * fVar163 - local_248._8_4_ * fVar166;
      auVar284._12_4_ = fVar158 * 0.0 - fVar196 * 0.0;
      auVar271._0_4_ = fVar318 * fVar308 - fVar99 * fVar227;
      auVar271._4_4_ = fVar291 * fVar170 - fVar162 * fVar248;
      auVar271._8_4_ = fVar163 * fVar294 - fVar166 * fVar307;
      auVar271._12_4_ = fVar158 * 0.0 - fVar196 * 0.0;
      auVar93._8_4_ = auVar328._8_4_;
      auVar93._0_8_ = auVar328._0_8_;
      auVar93._12_4_ = auVar328._12_4_;
      auVar70 = minps(auVar93,auVar134);
      auVar255 = maxps(auVar328,auVar134);
      auVar135._8_4_ = auVar224._8_4_;
      auVar135._0_8_ = auVar224._0_8_;
      auVar135._12_4_ = auVar224._12_4_;
      auVar124 = minps(auVar135,auVar149);
      auVar70 = minps(auVar70,auVar124);
      auVar124 = maxps(auVar224,auVar149);
      auVar323 = maxps(auVar255,auVar124);
      auVar136._8_4_ = auVar312._8_4_;
      auVar136._0_8_ = auVar312._0_8_;
      auVar136._12_4_ = auVar312._12_4_;
      auVar124 = minps(auVar136,auVar164);
      auVar126 = maxps(auVar312,auVar164);
      auVar150._8_4_ = auVar284._8_4_;
      auVar150._0_8_ = auVar284._0_8_;
      auVar150._12_4_ = auVar284._12_4_;
      auVar255 = minps(auVar150,auVar271);
      auVar124 = minps(auVar124,auVar255);
      auVar70 = minps(auVar70,auVar124);
      auVar124 = maxps(auVar284,auVar271);
      auVar124 = maxps(auVar126,auVar124);
      auVar124 = maxps(auVar323,auVar124);
      auVar329._0_4_ =
           -(uint)(local_268 <= auVar124._0_4_ && auVar70._0_4_ <= local_258) & auVar190._0_4_;
      auVar329._4_4_ =
           -(uint)(fStack_264 <= auVar124._4_4_ && auVar70._4_4_ <= fStack_254) & auVar190._4_4_;
      auVar329._8_4_ =
           -(uint)(fStack_260 <= auVar124._8_4_ && auVar70._8_4_ <= fStack_250) & auVar190._8_4_;
      auVar329._12_4_ =
           -(uint)(fStack_25c <= auVar124._12_4_ && auVar70._12_4_ <= fStack_24c) & auVar190._12_4_;
      uVar63 = movmskps(0,auVar329);
      uVar54 = (ulong)uVar63;
    }
    if ((uint)uVar54 != 0) {
      uVar59 = (ulong)uVar64;
      auStack_338[uVar59] = (uint)uVar54;
      *(undefined8 *)(afStack_108 + uVar59 * 2) = local_518;
      auStack_58[uVar59] = local_548;
      uVar64 = uVar64 + 1;
    }
    do {
      if (uVar64 == 0) {
        if (local_54c != 0) {
          return local_54d;
        }
        fVar140 = *(float *)(ray + k * 4 + 0x80);
        auVar119._4_4_ = -(uint)(fStack_294 <= fVar140);
        auVar119._0_4_ = -(uint)(local_298 <= fVar140);
        auVar119._8_4_ = -(uint)(fStack_290 <= fVar140);
        auVar119._12_4_ = -(uint)(fStack_28c <= fVar140);
        uVar63 = movmskps((int)uVar54,auVar119);
        uVar63 = (uint)uVar5 & (uint)local_3e8 & uVar63;
        local_54d = uVar63 != 0;
        if (!local_54d) {
          return local_54d;
        }
        goto LAB_00bf71ef;
      }
      uVar63 = uVar64 - 1;
      uVar55 = (ulong)uVar63;
      uVar66 = auStack_338[uVar55];
      local_548 = auStack_58[uVar55];
      uVar54 = 0;
      if (uVar66 != 0) {
        for (; (uVar66 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
        }
      }
      uVar66 = uVar66 - 1 & uVar66;
      auStack_338[uVar55] = uVar66;
      if (uVar66 == 0) {
        uVar64 = uVar63;
      }
      uVar60 = uVar54 + 1;
      uVar59 = uVar60;
      if ((long)uVar60 < 0) {
        uVar59 = (ulong)((uint)uVar60 & 1) | uVar60 >> 1;
      }
      fVar99 = afStack_108[uVar55 * 2];
      fVar100 = afStack_108[uVar55 * 2 + 1];
      fVar101 = fVar99 * (1.0 - (float)uVar54 * 0.33333334) + fVar100 * (float)uVar54 * 0.33333334;
      fVar120 = fVar99 * (1.0 - (float)uVar60 * 0.33333334) + fVar100 * (float)uVar60 * 0.33333334;
      fVar162 = fVar99 * 0.0 + fVar100 * 0.0;
      fVar100 = fVar99 * 0.0 + fVar100 * 0.0;
      fVar99 = fVar120 - fVar101;
      local_518 = CONCAT44(fVar120,fVar101);
      if (0.16666667 <= fVar99) break;
      fVar317 = (float)local_548;
      fVar291 = (float)((ulong)local_548 >> 0x20);
      fVar166 = 1.0 - fVar317;
      fVar196 = 1.0 - fVar317;
      fVar210 = 1.0 - fVar291;
      fVar215 = 1.0 - fVar291;
      fVar248 = fVar199 * fVar166 + (float)local_378 * fVar317;
      fVar307 = fVar212 * fVar196 + local_378._4_4_ * fVar317;
      fVar310 = fVar199 * fVar210 + (float)uStack_370 * fVar291;
      fVar315 = fVar212 * fVar215 + uStack_370._4_4_ * fVar291;
      fVar160 = (float)local_348 * fVar166 + (float)local_388 * fVar317;
      fVar306 = local_348._4_4_ * fVar196 + local_388._4_4_ * fVar317;
      fVar161 = (float)uStack_340 * fVar210 + (float)uStack_380 * fVar291;
      fVar308 = uStack_340._4_4_ * fVar215 + uStack_380._4_4_ * fVar291;
      fVar170 = (float)local_358 * fVar166 + (float)local_398 * fVar317;
      fVar320 = local_358._4_4_ * fVar196 + local_398._4_4_ * fVar317;
      fVar197 = (float)uStack_350 * fVar210 + (float)uStack_390 * fVar291;
      fVar214 = uStack_350._4_4_ * fVar215 + uStack_390._4_4_ * fVar291;
      fVar318 = (fVar166 * (float)local_368 + fVar317 * (float)local_3a8) - fVar170;
      fVar163 = (fVar196 * local_368._4_4_ + fVar317 * local_3a8._4_4_) - fVar320;
      fVar167 = (fVar210 * (float)uStack_360 + fVar291 * (float)uStack_3a0) - fVar197;
      fVar169 = (fVar215 * uStack_360._4_4_ + fVar291 * uStack_3a0._4_4_) - fVar214;
      fVar166 = fVar101 * (fVar170 - fVar160) + fVar160;
      fVar196 = fVar101 * (fVar320 - fVar306) + fVar306;
      fVar158 = fVar101 * (fVar197 - fVar161) + fVar161;
      fVar304 = fVar101 * (fVar214 - fVar308) + fVar308;
      fVar294 = (fVar170 - fVar160) * fVar120 + fVar160;
      fVar321 = (fVar320 - fVar306) * fVar120 + fVar306;
      fVar198 = (fVar197 - fVar161) * fVar120 + fVar161;
      fVar216 = (fVar214 - fVar308) * fVar120 + fVar308;
      fVar210 = fVar101 * (fVar160 - fVar248) + fVar248;
      fVar215 = fVar101 * (fVar306 - fVar307) + fVar307;
      fVar227 = fVar101 * (fVar161 - fVar310) + fVar310;
      fVar231 = fVar101 * (fVar308 - fVar315) + fVar315;
      fVar210 = (fVar166 - fVar210) * fVar101 + fVar210;
      fVar215 = (fVar196 - fVar215) * fVar101 + fVar215;
      fVar227 = (fVar158 - fVar227) * fVar101 + fVar227;
      fVar231 = (fVar304 - fVar231) * fVar101 + fVar231;
      fVar166 = (((fVar101 * fVar318 + fVar170) - fVar166) * fVar101 + fVar166) - fVar210;
      fVar196 = (((fVar101 * fVar163 + fVar320) - fVar196) * fVar101 + fVar196) - fVar215;
      fVar158 = (((fVar101 * fVar167 + fVar197) - fVar158) * fVar101 + fVar158) - fVar227;
      fVar304 = (((fVar101 * fVar169 + fVar214) - fVar304) * fVar101 + fVar304) - fVar231;
      fVar210 = fVar101 * fVar166 + fVar210;
      fVar215 = fVar101 * fVar196 + fVar215;
      fVar227 = fVar101 * fVar158 + fVar227;
      fVar231 = fVar101 * fVar304 + fVar231;
      fVar248 = (fVar160 - fVar248) * fVar120 + fVar248;
      fVar307 = (fVar306 - fVar307) * fVar120 + fVar307;
      fVar310 = (fVar161 - fVar310) * fVar120 + fVar310;
      fVar315 = (fVar308 - fVar315) * fVar120 + fVar315;
      fVar248 = (fVar294 - fVar248) * fVar120 + fVar248;
      fVar307 = (fVar321 - fVar307) * fVar120 + fVar307;
      fVar310 = (fVar198 - fVar310) * fVar120 + fVar310;
      fVar315 = (fVar216 - fVar315) * fVar120 + fVar315;
      fVar101 = (((fVar318 * fVar120 + fVar170) - fVar294) * fVar120 + fVar294) - fVar248;
      fVar160 = (((fVar163 * fVar120 + fVar320) - fVar321) * fVar120 + fVar321) - fVar307;
      fVar306 = (((fVar167 * fVar120 + fVar197) - fVar198) * fVar120 + fVar198) - fVar310;
      fVar169 = (((fVar169 * fVar120 + fVar214) - fVar216) * fVar120 + fVar216) - fVar315;
      fVar248 = fVar120 * fVar101 + fVar248;
      fVar307 = fVar120 * fVar160 + fVar307;
      fVar310 = fVar120 * fVar306 + fVar310;
      fVar315 = fVar120 * fVar169 + fVar315;
      fVar120 = fVar99 * 0.33333334;
      fVar318 = fVar166 * 3.0 * fVar120 + fVar210;
      fVar163 = fVar196 * 3.0 * fVar120 + fVar215;
      fVar158 = fVar158 * 3.0 * fVar120 + fVar227;
      fVar304 = fVar304 * 3.0 * fVar120 + fVar231;
      fVar167 = fVar248 - fVar120 * fVar101 * 3.0;
      fVar160 = fVar307 - fVar120 * fVar160 * 3.0;
      fVar306 = fVar310 - fVar120 * fVar306 * 3.0;
      fVar169 = fVar315 - fVar120 * fVar169 * 3.0;
      local_518 = CONCAT44(fVar231,fVar227);
      fVar294 = (fVar310 - fVar248) + (fVar227 - fVar210);
      fVar320 = (fVar315 - fVar307) + (fVar231 - fVar215);
      auVar240._0_4_ = fVar320 * fVar307;
      auVar240._4_4_ = fVar320 * fVar307;
      auVar240._8_4_ = fVar320 * fVar315;
      auVar240._12_4_ = fVar320 * fVar315;
      fVar101 = fVar210 * fVar294 + fVar215 * fVar320;
      fVar120 = fVar227 * fVar294 + fVar231 * fVar320;
      fVar321 = fVar318 * fVar294 + fVar163 * fVar320;
      fVar197 = fVar158 * fVar294 + fVar304 * fVar320;
      fVar161 = fVar167 * fVar294 + fVar160 * fVar320;
      auVar256._4_4_ = fVar160 * fVar294 + fVar160 * fVar320;
      auVar256._0_4_ = fVar161;
      fVar308 = fVar306 * fVar294 + fVar169 * fVar320;
      fVar166 = fVar294 * fVar248 + auVar240._0_4_;
      fVar170 = fVar294 * fVar310 + auVar240._8_4_;
      auVar21._4_8_ = auVar240._8_8_;
      auVar21._0_4_ = fVar163 * fVar294 + fVar163 * fVar320;
      auVar241._0_8_ = auVar21._0_8_ << 0x20;
      auVar241._8_4_ = fVar197;
      auVar241._12_4_ = fVar304 * fVar294 + fVar304 * fVar320;
      fVar196 = fVar321;
      if (fVar321 <= fVar101) {
        fVar196 = fVar101;
        fVar101 = fVar321;
      }
      auVar242._8_8_ = auVar241._8_8_;
      auVar242._0_8_ = auVar242._8_8_;
      auVar256._8_4_ = fVar308;
      auVar256._12_4_ = fVar169 * fVar294 + fVar169 * fVar320;
      if (fVar166 <= fVar161) {
        auVar256._0_4_ = fVar166;
      }
      if (auVar256._0_4_ <= fVar101) {
        fVar101 = auVar256._0_4_;
      }
      auVar22._4_8_ = auVar256._8_8_;
      auVar22._0_4_ = fVar294 * fVar307 + auVar240._4_4_;
      auVar257._0_8_ = auVar22._0_8_ << 0x20;
      auVar257._8_4_ = fVar170;
      auVar257._12_4_ = fVar294 * fVar315 + auVar240._12_4_;
      if (fVar166 <= fVar161) {
        fVar166 = fVar161;
      }
      auVar258._8_8_ = auVar257._8_8_;
      auVar258._0_8_ = auVar258._8_8_;
      if (fVar166 <= fVar196) {
        fVar166 = fVar196;
      }
      if (fVar197 <= fVar120) {
        auVar242._0_4_ = fVar120;
        fVar120 = fVar197;
      }
      fVar196 = fVar308;
      if (fVar170 <= fVar308) {
        fVar196 = fVar170;
      }
      if (fVar196 <= fVar120) {
        fVar120 = fVar196;
      }
      if (fVar170 <= fVar308) {
        auVar258._0_4_ = fVar308;
      }
      if (auVar258._0_4_ <= auVar242._0_4_) {
        auVar258._0_4_ = auVar242._0_4_;
      }
      uVar59 = CONCAT71((int7)(uVar59 >> 8),fVar99 < 0.001);
      uVar23 = (undefined3)(uVar63 >> 8);
      uVar54 = (ulong)CONCAT31(uVar23,3 < uVar64);
      fVar196 = auVar258._0_4_;
      if ((0.0001 <= fVar101) || (fVar196 <= -0.0001)) {
        if ((-0.0001 < fVar166 && fVar120 < 0.0001) ||
           ((fVar101 < 0.0001 && -0.0001 < fVar166 || (fVar120 < 0.0001 && -0.0001 < fVar196))))
        goto LAB_00bf8a9e;
        bVar26 = true;
      }
      else {
LAB_00bf8a9e:
        bVar51 = 3 < uVar64 || fVar99 < 0.001;
        uVar54 = (ulong)CONCAT31(uVar23,bVar51);
        fVar170 = (float)(~-(uint)(fVar101 < 0.0) & 0x3f800000 | -(uint)(fVar101 < 0.0) & 0xbf800000
                         );
        fVar308 = (float)(~-(uint)(fVar166 < 0.0) & 0x3f800000 | -(uint)(fVar166 < 0.0) & 0xbf800000
                         );
        fVar161 = 0.0;
        if ((fVar170 == fVar308) && (!NAN(fVar170) && !NAN(fVar308))) {
          fVar161 = INFINITY;
        }
        fVar294 = 0.0;
        if ((fVar170 == fVar308) && (!NAN(fVar170) && !NAN(fVar308))) {
          fVar294 = -INFINITY;
        }
        fVar320 = (float)(~-(uint)(fVar120 < 0.0) & 0x3f800000 | -(uint)(fVar120 < 0.0) & 0xbf800000
                         );
        if ((fVar170 != fVar320) || (fVar321 = fVar294, NAN(fVar170) || NAN(fVar320))) {
          if ((fVar120 != fVar101) || (NAN(fVar120) || NAN(fVar101))) {
            fVar120 = -fVar101 / (fVar120 - fVar101);
            fVar120 = (1.0 - fVar120) * 0.0 + fVar120;
            fVar321 = fVar120;
          }
          else {
            fVar120 = INFINITY;
            if ((fVar101 == 0.0) && (fVar120 = INFINITY, !NAN(fVar101))) {
              fVar120 = 0.0;
            }
            fVar321 = *(float *)(&DAT_01ff1ec4 + (ulong)(-(uint)(fVar101 == 0.0) & 1) * 4);
          }
          if (fVar120 <= fVar161) {
            fVar161 = fVar120;
          }
          if (fVar321 <= fVar294) {
            fVar321 = fVar294;
          }
        }
        uVar59 = (ulong)(fVar196 < 0.0);
        fVar101 = *(float *)(&DAT_01ff1ecc + uVar59 * 4);
        if ((fVar308 != fVar101) || (fVar120 = fVar321, NAN(fVar308) || NAN(fVar101))) {
          if ((fVar196 != fVar166) || (NAN(fVar196) || NAN(fVar166))) {
            fVar196 = -fVar166 / (fVar196 - fVar166);
            fVar196 = (1.0 - fVar196) * 0.0 + fVar196;
            fVar120 = fVar196;
          }
          else {
            fVar196 = INFINITY;
            if ((fVar166 == 0.0) && (fVar196 = INFINITY, !NAN(fVar166))) {
              fVar196 = 0.0;
            }
            uVar59 = (ulong)(-(uint)(fVar166 == 0.0) & 1);
            fVar120 = *(float *)(&DAT_01ff1ec4 + uVar59 * 4);
          }
          if (fVar196 <= fVar161) {
            fVar161 = fVar196;
          }
          if (fVar120 <= fVar321) {
            fVar120 = fVar321;
          }
        }
        if ((fVar320 != fVar101) || (NAN(fVar320) || NAN(fVar101))) {
          fVar161 = (float)(~-(uint)(fVar161 < 1.0) & 0x3f800000 |
                           (uint)fVar161 & -(uint)(fVar161 < 1.0));
          fVar120 = (float)(~-(uint)(fVar120 < 1.0) & (uint)fVar120 |
                           -(uint)(fVar120 < 1.0) & 0x3f800000);
        }
        fVar161 = (float)(~-(uint)(fVar161 < 0.0) & (uint)fVar161);
        fVar101 = (float)(~-(uint)(fVar120 < 1.0) & 0x3f800000 |
                         (uint)fVar120 & -(uint)(fVar120 < 1.0));
        bVar26 = true;
        if (fVar161 <= fVar101) {
          fVar161 = fVar161 + -0.1;
          fVar101 = fVar101 + 0.1;
          uVar63 = -(uint)(fVar101 < 1.0);
          fVar161 = (float)(~-(uint)(fVar161 < 0.0) & (uint)fVar161);
          fVar321 = (float)(~uVar63 & 0x3f800000 | (uint)fVar101 & uVar63);
          fVar308 = 1.0 - fVar161;
          fVar170 = 1.0 - fVar161;
          fVar294 = 1.0 - fVar321;
          fVar320 = 1.0 - fVar321;
          fVar101 = fVar210 * fVar308 + fVar227 * fVar161;
          fVar120 = fVar215 * fVar170 + fVar231 * fVar161;
          fVar166 = fVar210 * fVar294 + fStack_520 * fVar321;
          fVar196 = fVar215 * fVar320 + fStack_51c * fVar321;
          fVar210 = fVar318 * fVar308 + fVar158 * fVar161;
          fVar215 = fVar163 * fVar170 + fVar304 * fVar161;
          fVar318 = fVar318 * fVar294 + fVar158 * fVar321;
          fVar163 = fVar163 * fVar320 + fVar304 * fVar321;
          fVar158 = fVar167 * fVar308 + fVar306 * fVar161;
          fVar304 = fVar160 * fVar170 + fVar169 * fVar161;
          fVar167 = fVar167 * fVar294 + fVar306 * fVar321;
          fVar160 = fVar160 * fVar320 + fVar169 * fVar321;
          fVar306 = fVar308 * fVar248 + fVar310 * fVar161;
          fVar169 = fVar170 * fVar307 + fVar315 * fVar161;
          fVar248 = fVar294 * fVar248 + fVar262 * fVar321;
          fVar307 = fVar320 * fVar307 + fVar305 * fVar321;
          fVar232 = fVar317 * (1.0 - fVar161) + fVar291 * fVar161;
          fStack_51c = fVar317 * (1.0 - fVar321) + fVar291 * fVar321;
          fVar99 = 1.0 / fVar99;
          auVar116._0_4_ = fVar248 - fVar306;
          auVar116._4_4_ = fVar307 - fVar169;
          auVar116._8_4_ = fVar248 - fVar248;
          auVar116._12_4_ = fVar307 - fVar307;
          auVar151._0_8_ = CONCAT44(fVar160 - fVar304,fVar167 - fVar158);
          auVar151._8_4_ = fVar167 - fVar167;
          auVar151._12_4_ = fVar160 - fVar160;
          auVar272._0_4_ = fVar318 - fVar210;
          auVar272._4_4_ = fVar163 - fVar215;
          auVar272._8_4_ = fVar318 - fVar318;
          auVar272._12_4_ = fVar163 - fVar163;
          auVar225._0_8_ = CONCAT44((fVar215 - fVar120) * 3.0,(fVar210 - fVar101) * 3.0);
          auVar225._8_4_ = (fVar318 - fVar166) * 3.0;
          auVar225._12_4_ = (fVar163 - fVar196) * 3.0;
          auVar191._0_8_ = CONCAT44((fVar304 - fVar215) * 3.0,(fVar158 - fVar210) * 3.0);
          auVar191._8_4_ = (fVar167 - fVar318) * 3.0;
          auVar191._12_4_ = (fVar160 - fVar163) * 3.0;
          auVar259._0_4_ = (fVar306 - fVar158) * 3.0;
          auVar259._4_4_ = (fVar169 - fVar304) * 3.0;
          auVar259._8_4_ = (fVar248 - fVar167) * 3.0;
          auVar259._12_4_ = (fVar307 - fVar160) * 3.0;
          auVar202._8_4_ = auVar191._8_4_;
          auVar202._0_8_ = auVar191._0_8_;
          auVar202._12_4_ = auVar191._12_4_;
          auVar124 = minps(auVar202,auVar259);
          auVar70 = maxps(auVar191,auVar259);
          auVar243._8_4_ = auVar225._8_4_;
          auVar243._0_8_ = auVar225._0_8_;
          auVar243._12_4_ = auVar225._12_4_;
          auVar126 = minps(auVar243,auVar124);
          auVar255 = maxps(auVar225,auVar70);
          auVar24._4_8_ = auVar70._8_8_;
          auVar24._0_4_ = auVar126._4_4_;
          auVar192._0_8_ = auVar24._0_8_ << 0x20;
          auVar192._8_4_ = auVar126._8_4_;
          auVar192._12_4_ = auVar126._12_4_;
          auVar193._8_8_ = auVar126._8_8_;
          auVar193._0_8_ = auVar192._8_8_;
          auVar25._4_8_ = auVar124._8_8_;
          auVar25._0_4_ = auVar255._4_4_;
          auVar203._0_8_ = auVar25._0_8_ << 0x20;
          auVar203._8_4_ = auVar255._8_4_;
          auVar203._12_4_ = auVar255._12_4_;
          auVar204._8_8_ = auVar255._8_8_;
          auVar204._0_8_ = auVar203._8_8_;
          auVar124 = minps(auVar126,auVar193);
          auVar70 = maxps(auVar255,auVar204);
          fVar321 = auVar124._0_4_ * fVar99;
          fVar197 = auVar124._4_4_ * fVar99;
          fVar198 = auVar124._8_4_ * fVar99;
          fVar214 = auVar124._12_4_ * fVar99;
          fVar158 = fVar99 * auVar70._0_4_;
          fVar167 = fVar99 * auVar70._4_4_;
          fVar306 = fVar99 * auVar70._8_4_;
          fVar99 = fVar99 * auVar70._12_4_;
          fVar294 = 1.0 / (fStack_51c - fVar232);
          auVar137._0_8_ = CONCAT44(fVar196 - fVar120,fVar166 - fVar101);
          auVar137._8_4_ = fVar166 - fVar166;
          auVar137._12_4_ = fVar196 - fVar196;
          auVar205._8_4_ = auVar137._8_4_;
          auVar205._0_8_ = auVar137._0_8_;
          auVar205._12_4_ = auVar137._12_4_;
          auVar255 = minps(auVar205,auVar272);
          auVar124 = maxps(auVar137,auVar272);
          auVar94._8_4_ = auVar151._8_4_;
          auVar94._0_8_ = auVar151._0_8_;
          auVar94._12_4_ = auVar151._12_4_;
          auVar70 = minps(auVar94,auVar116);
          auVar255 = minps(auVar255,auVar70);
          auVar70 = maxps(auVar151,auVar116);
          auVar70 = maxps(auVar124,auVar70);
          fVar308 = auVar255._0_4_ * fVar294;
          fVar170 = auVar255._4_4_ * fVar294;
          fVar320 = fVar294 * auVar70._0_4_;
          fVar294 = fVar294 * auVar70._4_4_;
          local_548 = CONCAT44(fStack_51c,fVar232);
          auVar194._4_4_ = fStack_51c;
          auVar194._0_4_ = fVar231;
          auVar194._8_4_ = fVar162;
          auVar194._12_4_ = fVar100;
          fVar101 = (fVar227 + fVar231) * 0.5;
          fVar120 = (fVar232 + fStack_51c) * 0.5;
          fVar166 = (fVar231 + fVar162) * 0.0;
          fVar196 = (fStack_51c + fVar100) * 0.0;
          fVar210 = local_118 * fVar101 + fVar199;
          fVar248 = fStack_114 * fVar101 + fVar212;
          fVar215 = fStack_110 * fVar101 + fVar274;
          fVar307 = fStack_10c * fVar101 + fVar275;
          fVar317 = local_128 * fVar101 + fVar293;
          fVar318 = fStack_124 * fVar101 + fVar303;
          fVar291 = fStack_120 * fVar101 + fVar276;
          fVar163 = fStack_11c * fVar101 + fVar286;
          fVar210 = (fVar317 - fVar210) * fVar101 + fVar210;
          fVar248 = (fVar318 - fVar248) * fVar101 + fVar248;
          fVar215 = (fVar291 - fVar215) * fVar101 + fVar215;
          fVar307 = (fVar163 - fVar307) * fVar101 + fVar307;
          fVar317 = (((local_138 * fVar101 + fVar310) - fVar317) * fVar101 + fVar317) - fVar210;
          fVar318 = (((fStack_134 * fVar101 + fVar315) - fVar318) * fVar101 + fVar318) - fVar248;
          fVar291 = (((fStack_130 * fVar101 + fVar288) - fVar291) * fVar101 + fVar291) - fVar215;
          fVar163 = (((fStack_12c * fVar101 + fVar290) - fVar163) * fVar101 + fVar163) - fVar307;
          fVar210 = fVar101 * fVar317 + fVar210;
          fVar248 = fVar101 * fVar318 + fVar248;
          fVar317 = fVar317 * 3.0;
          fVar318 = fVar318 * 3.0;
          fVar215 = (fVar101 * fVar291 + fVar215) - fVar210;
          fVar307 = (fVar101 * fVar163 + fVar307) - fVar248;
          fVar317 = (fVar291 * 3.0 - fVar317) * fVar120 + fVar317;
          fVar318 = (fVar163 * 3.0 - fVar318) * fVar120 + fVar318;
          auVar117._0_8_ = CONCAT44(fVar317,fVar215) ^ 0x80000000;
          auVar117._8_4_ = fVar317;
          auVar117._12_4_ = fVar317;
          fVar216 = fVar227 - fVar101;
          fVar217 = fVar232 - fVar120;
          fVar218 = fVar231 - fVar166;
          fVar228 = fStack_51c - fVar196;
          fVar229 = fVar231 - fVar101;
          fVar230 = fStack_51c - fVar120;
          fVar162 = fVar162 - fVar166;
          fVar100 = fVar100 - fVar196;
          fVar210 = fVar215 * fVar120 + fVar210;
          fVar248 = fVar307 * fVar120 + fVar248;
          auVar138._0_8_ = CONCAT44(fVar318,fVar307) ^ 0x8000000000000000;
          auVar138._8_4_ = -fVar318;
          auVar138._12_4_ = -fVar318;
          auVar300._0_4_ = fVar307 * fVar317 - fVar318 * fVar215;
          auVar300._4_4_ = auVar300._0_4_;
          auVar300._8_4_ = auVar300._0_4_;
          auVar300._12_4_ = auVar300._0_4_;
          auVar124 = divps(auVar138,auVar300);
          auVar70 = divps(auVar117,auVar300);
          fVar317 = auVar124._0_4_;
          fVar318 = auVar124._4_4_;
          fVar215 = auVar70._0_4_;
          fVar307 = auVar70._4_4_;
          fVar101 = fVar101 - (fVar248 * fVar215 + fVar210 * fVar317);
          fVar166 = fVar120 - (fVar248 * fVar307 + fVar210 * fVar318);
          fVar196 = fVar120 - (fVar248 * auVar70._8_4_ + fVar210 * auVar124._8_4_);
          fVar120 = fVar120 - (fVar248 * auVar70._12_4_ + fVar210 * auVar124._12_4_);
          auVar324._0_8_ = CONCAT44(fVar318 * fVar308,fVar318 * fVar321);
          auVar324._8_4_ = fVar318 * fVar197;
          auVar324._12_4_ = fVar318 * fVar170;
          auVar260._0_4_ = fVar318 * fVar158;
          auVar260._4_4_ = fVar318 * fVar320;
          auVar260._8_4_ = fVar318 * fVar167;
          auVar260._12_4_ = fVar318 * fVar294;
          auVar330._8_4_ = auVar324._8_4_;
          auVar330._0_8_ = auVar324._0_8_;
          auVar330._12_4_ = auVar324._12_4_;
          auVar126 = minps(auVar330,auVar260);
          auVar124 = maxps(auVar260,auVar324);
          auVar152._0_8_ = CONCAT44(fVar307 * fVar170,fVar307 * fVar197);
          auVar152._8_4_ = fVar307 * fVar198;
          auVar152._12_4_ = fVar307 * fVar214;
          auVar325._0_4_ = fVar307 * fVar167;
          auVar325._4_4_ = fVar307 * fVar294;
          auVar325._8_4_ = fVar307 * fVar306;
          auVar325._12_4_ = fVar307 * fVar99;
          auVar244._8_4_ = auVar152._8_4_;
          auVar244._0_8_ = auVar152._0_8_;
          auVar244._12_4_ = auVar152._12_4_;
          auVar70 = minps(auVar244,auVar325);
          auVar255 = maxps(auVar325,auVar152);
          fVar210 = 0.0 - (auVar255._0_4_ + auVar124._0_4_);
          fVar248 = 1.0 - (auVar255._4_4_ + auVar124._4_4_);
          fVar291 = 0.0 - (auVar255._8_4_ + auVar124._8_4_);
          fVar163 = 0.0 - (auVar255._12_4_ + auVar124._12_4_);
          fVar304 = 0.0 - (auVar70._0_4_ + auVar126._0_4_);
          fVar160 = 1.0 - (auVar70._4_4_ + auVar126._4_4_);
          fVar169 = 0.0 - (auVar70._8_4_ + auVar126._8_4_);
          fVar161 = 0.0 - (auVar70._12_4_ + auVar126._12_4_);
          auVar261._0_8_ = CONCAT44(fVar217 * fVar248,fVar216 * fVar210);
          auVar261._8_4_ = fVar218 * fVar291;
          auVar261._12_4_ = fVar228 * fVar163;
          auVar301._0_8_ = CONCAT44(fVar308 * fVar317,fVar321 * fVar317);
          auVar301._8_4_ = fVar197 * fVar317;
          auVar301._12_4_ = fVar170 * fVar317;
          auVar245._0_4_ = fVar317 * fVar158;
          auVar245._4_4_ = fVar317 * fVar320;
          auVar245._8_4_ = fVar317 * fVar167;
          auVar245._12_4_ = fVar317 * fVar294;
          auVar313._8_4_ = auVar301._8_4_;
          auVar313._0_8_ = auVar301._0_8_;
          auVar313._12_4_ = auVar301._12_4_;
          auVar124 = minps(auVar313,auVar245);
          auVar70 = maxps(auVar245,auVar301);
          auVar206._0_8_ = CONCAT44(fVar170 * fVar215,fVar197 * fVar215);
          auVar206._8_4_ = fVar198 * fVar215;
          auVar206._12_4_ = fVar214 * fVar215;
          auVar326._0_4_ = fVar215 * fVar167;
          auVar326._4_4_ = fVar215 * fVar294;
          auVar326._8_4_ = fVar215 * fVar306;
          auVar326._12_4_ = fVar215 * fVar99;
          auVar331._8_4_ = auVar206._8_4_;
          auVar331._0_8_ = auVar206._0_8_;
          auVar331._12_4_ = auVar206._12_4_;
          auVar126 = minps(auVar331,auVar326);
          auVar302._0_4_ = fVar216 * fVar304;
          auVar302._4_4_ = fVar217 * fVar160;
          auVar302._8_4_ = fVar218 * fVar169;
          auVar302._12_4_ = fVar228 * fVar161;
          auVar153._0_8_ = CONCAT44(fVar248 * fVar230,fVar210 * fVar229);
          auVar153._8_4_ = fVar291 * fVar162;
          auVar153._12_4_ = fVar163 * fVar100;
          auVar165._0_4_ = fVar304 * fVar229;
          auVar165._4_4_ = fVar160 * fVar230;
          auVar165._8_4_ = fVar169 * fVar162;
          auVar165._12_4_ = fVar161 * fVar100;
          auVar255 = maxps(auVar326,auVar206);
          fVar99 = 1.0 - (auVar255._0_4_ + auVar70._0_4_);
          fVar210 = 0.0 - (auVar255._4_4_ + auVar70._4_4_);
          fVar248 = 0.0 - (auVar255._8_4_ + auVar70._8_4_);
          fVar291 = 0.0 - (auVar255._12_4_ + auVar70._12_4_);
          fVar163 = 1.0 - (auVar126._0_4_ + auVar124._0_4_);
          fVar158 = 0.0 - (auVar126._4_4_ + auVar124._4_4_);
          fVar304 = 0.0 - (auVar126._8_4_ + auVar124._8_4_);
          fVar167 = 0.0 - (auVar126._12_4_ + auVar124._12_4_);
          auVar246._0_8_ = CONCAT44(fVar217 * fVar210,fVar216 * fVar99);
          auVar246._8_4_ = fVar218 * fVar248;
          auVar246._12_4_ = fVar228 * fVar291;
          auVar273._0_4_ = fVar216 * fVar163;
          auVar273._4_4_ = fVar217 * fVar158;
          auVar273._8_4_ = fVar218 * fVar304;
          auVar273._12_4_ = fVar228 * fVar167;
          auVar207._0_8_ = CONCAT44(fVar210 * fVar230,fVar99 * fVar229);
          auVar207._8_4_ = fVar248 * fVar162;
          auVar207._12_4_ = fVar291 * fVar100;
          auVar226._0_4_ = fVar163 * fVar229;
          auVar226._4_4_ = fVar158 * fVar230;
          auVar226._8_4_ = fVar304 * fVar162;
          auVar226._12_4_ = fVar167 * fVar100;
          auVar285._8_4_ = auVar246._8_4_;
          auVar285._0_8_ = auVar246._0_8_;
          auVar285._12_4_ = auVar246._12_4_;
          auVar70 = minps(auVar285,auVar273);
          auVar314._8_4_ = auVar207._8_4_;
          auVar314._0_8_ = auVar207._0_8_;
          auVar314._12_4_ = auVar207._12_4_;
          auVar124 = minps(auVar314,auVar226);
          auVar126 = minps(auVar70,auVar124);
          auVar124 = maxps(auVar273,auVar246);
          auVar70 = maxps(auVar226,auVar207);
          auVar255 = maxps(auVar70,auVar124);
          auVar208._8_4_ = auVar261._8_4_;
          auVar208._0_8_ = auVar261._0_8_;
          auVar208._12_4_ = auVar261._12_4_;
          auVar70 = minps(auVar208,auVar302);
          auVar247._8_4_ = auVar153._8_4_;
          auVar247._0_8_ = auVar153._0_8_;
          auVar247._12_4_ = auVar153._12_4_;
          auVar124 = minps(auVar247,auVar165);
          auVar124 = minps(auVar70,auVar124);
          auVar323 = maxps(auVar302,auVar261);
          auVar70 = maxps(auVar165,auVar153);
          auVar70 = maxps(auVar70,auVar323);
          auVar209._0_4_ = auVar126._4_4_ + auVar126._0_4_ + fVar101;
          auVar209._4_4_ = auVar124._4_4_ + auVar124._0_4_ + fVar166;
          auVar209._8_4_ = auVar126._8_4_ + auVar126._4_4_ + fVar196;
          auVar209._12_4_ = auVar126._12_4_ + auVar124._4_4_ + fVar120;
          fVar99 = auVar255._4_4_ + auVar255._0_4_ + fVar101;
          fVar100 = auVar70._4_4_ + auVar70._0_4_ + fVar166;
          auVar154._4_4_ = fVar100;
          auVar154._0_4_ = fVar99;
          auVar28._4_4_ = fVar232;
          auVar28._0_4_ = fVar227;
          auVar28._8_4_ = fVar231;
          auVar28._12_4_ = fStack_51c;
          auVar124 = maxps(auVar28,auVar209);
          auVar154._8_4_ = auVar255._8_4_ + auVar255._4_4_ + fVar196;
          auVar154._12_4_ = auVar255._12_4_ + auVar70._4_4_ + fVar120;
          auVar70 = minps(auVar154,auVar194);
          iVar58 = -(uint)(auVar70._0_4_ < auVar124._0_4_);
          iVar65 = -(uint)(auVar70._4_4_ < auVar124._4_4_);
          auVar156._4_4_ = iVar65;
          auVar156._0_4_ = iVar58;
          auVar156._8_4_ = iVar65;
          auVar156._12_4_ = iVar65;
          auVar155._8_8_ = auVar156._8_8_;
          auVar155._4_4_ = iVar58;
          auVar155._0_4_ = iVar58;
          uVar63 = movmskpd((int)uVar59,auVar155);
          uVar59 = (ulong)uVar63;
          fStack_520 = fVar231;
          if (uVar63 == 0) {
            uVar59 = 0;
            if ((fVar227 < auVar209._0_4_) && (fVar99 < fVar231)) {
              iVar58 = -(uint)(fVar100 < fStack_51c);
              uVar59 = (ulong)CONCAT11((char)((uint)iVar58 >> 8),
                                       (byte)iVar58 & fVar232 < auVar209._4_4_);
            }
            bVar52 = bVar51 | (byte)uVar59;
            uVar54 = (ulong)CONCAT31(uVar23,bVar52);
            if (bVar52 == 1) {
              uVar54 = 200;
              do {
                fVar100 = 1.0 - fVar101;
                fVar196 = fVar101 * fVar101 * fVar101;
                fVar162 = fVar101 * fVar101 * 3.0 * fVar100;
                fVar99 = fVar100 * fVar100 * fVar100;
                fVar210 = fVar101 * 3.0 * fVar100 * fVar100;
                fVar100 = fVar99 * fVar199 +
                          fVar210 * fVar293 + fVar162 * fVar310 + fVar196 * (float)local_148._0_4_;
                fVar120 = fVar99 * fVar212 +
                          fVar210 * fVar303 + fVar162 * fVar315 + fVar196 * (float)local_148._4_4_;
                fVar100 = ((fVar99 * fVar274 +
                           fVar210 * fVar276 + fVar162 * fVar288 + fVar196 * fStack_140) - fVar100)
                          * fVar166 + fVar100;
                fVar120 = ((fVar99 * fVar275 +
                           fVar210 * fVar286 + fVar162 * fVar290 + fVar196 * fStack_13c) - fVar120)
                          * fVar166 + fVar120;
                fVar101 = fVar101 - (fVar120 * fVar215 + fVar100 * fVar317);
                fVar166 = fVar166 - (fVar120 * fVar307 + fVar100 * fVar318);
                fVar99 = ABS(fVar120);
                if (ABS(fVar120) <= ABS(fVar100)) {
                  fVar99 = ABS(fVar100);
                }
                if (fVar99 < fVar140) {
                  if ((((0.0 <= fVar101) && (fVar101 <= 1.0)) && (0.0 <= fVar166)) &&
                     (fVar166 <= 1.0)) {
                    fVar99 = pre->ray_space[k].vx.field_0.m128[2];
                    fVar100 = pre->ray_space[k].vy.field_0.m128[2];
                    fVar120 = pre->ray_space[k].vz.field_0.m128[2];
                    fVar231 = 1.0 - fVar166;
                    fVar227 = 1.0 - fVar101;
                    fVar162 = fVar227 * fVar227 * fVar227;
                    fVar196 = fVar101 * 3.0 * fVar227 * fVar227;
                    fVar215 = fVar101 * fVar101 * fVar101;
                    fVar210 = fVar101 * fVar101 * 3.0 * fVar227;
                    fVar99 = ((fStack_150 * fVar120 + fStack_154 * fVar100 + local_158 * fVar99) *
                              fVar231 +
                             (fStack_190 * fVar120 + fStack_194 * fVar100 + local_198 * fVar99) *
                             fVar166) * fVar162 +
                             ((fStack_160 * fVar120 + fStack_164 * fVar100 + local_168 * fVar99) *
                              fVar231 +
                             (fStack_1a0 * fVar120 + fStack_1a4 * fVar100 + local_1a8 * fVar99) *
                             fVar166) * fVar196 +
                             ((fStack_170 * fVar120 + fStack_174 * fVar100 + local_178 * fVar99) *
                              fVar231 +
                             (fStack_1b0 * fVar120 + fStack_1b4 * fVar100 + local_1b8 * fVar99) *
                             fVar166) * fVar210 +
                             (fVar231 * (fStack_180 * fVar120 +
                                        fStack_184 * fVar100 + local_188 * fVar99) +
                             (fVar120 * fStack_1c0 + fVar100 * fStack_1c4 + fVar99 * local_1c8) *
                             fVar166) * fVar215;
                    if ((fVar69 <= fVar99) &&
                       (fVar100 = *(float *)(ray + k * 4 + 0x80), fVar99 <= fVar100)) {
                      fVar307 = 1.0 - fVar166;
                      fVar310 = 1.0 - fVar166;
                      fVar315 = 1.0 - fVar166;
                      fVar120 = fVar200 * fVar307 + fVar249 * fVar166;
                      fVar231 = fVar211 * fVar310 + fVar265 * fVar166;
                      fVar248 = fVar213 * fVar315 + fVar250 * fVar166;
                      fVar317 = fVar263 * fVar307 + fVar122 * fVar166;
                      fVar291 = fVar309 * fVar310 + fVar141 * fVar166;
                      fVar158 = fVar238 * fVar315 + fVar159 * fVar166;
                      fVar318 = fVar317 - fVar120;
                      fVar163 = fVar291 - fVar231;
                      fVar304 = fVar158 - fVar248;
                      fVar120 = (((fVar120 - (fVar311 * fVar307 + fVar121 * fVar166)) * fVar227 +
                                 fVar101 * fVar318) * fVar227 +
                                (fVar318 * fVar227 +
                                ((fVar307 * fVar168 + local_288 * fVar166) - fVar317) * fVar101) *
                                fVar101) * 3.0;
                      fVar231 = (((fVar231 - (fVar316 * fVar310 + fVar139 * fVar166)) * fVar227 +
                                 fVar101 * fVar163) * fVar227 +
                                (fVar163 * fVar227 +
                                ((fVar310 * fVar171 + fStack_284 * fVar166) - fVar291) * fVar101) *
                                fVar101) * 3.0;
                      fVar227 = (((fVar248 - (fVar319 * fVar315 + fVar157 * fVar166)) * fVar227 +
                                 fVar101 * fVar304) * fVar227 +
                                (fVar304 * fVar227 +
                                ((fVar315 * fVar195 + fStack_280 * fVar166) - fVar158) * fVar101) *
                                fVar101) * 3.0;
                      pGVar13 = (context->scene->geometries).items[local_3f0].ptr;
                      if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                        uVar54 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (uVar54 = CONCAT71((int7)((ulong)context->args >> 8),1),
                              pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar248 = fVar162 * local_2a8 +
                                  fVar196 * local_2b8 + fVar210 * local_2c8 + fVar215 * local_2d8;
                        fVar307 = fVar162 * fStack_2a4 +
                                  fVar196 * fStack_2b4 + fVar210 * fStack_2c4 + fVar215 * fStack_2d4
                        ;
                        fVar162 = fVar162 * fStack_2a0 +
                                  fVar196 * fStack_2b0 + fVar210 * fStack_2c0 + fVar215 * fStack_2d0
                        ;
                        local_c8 = fVar307 * fVar120 - fVar231 * fVar248;
                        local_e8 = fVar162 * fVar231 - fVar227 * fVar307;
                        local_d8 = fVar248 * fVar227 - fVar120 * fVar162;
                        fStack_e4 = local_e8;
                        fStack_e0 = local_e8;
                        fStack_dc = local_e8;
                        fStack_d4 = local_d8;
                        fStack_d0 = local_d8;
                        fStack_cc = local_d8;
                        fStack_c4 = local_c8;
                        fStack_c0 = local_c8;
                        fStack_bc = local_c8;
                        local_b8 = fVar101;
                        fStack_b4 = fVar101;
                        fStack_b0 = fVar101;
                        fStack_ac = fVar101;
                        local_a8 = fVar166;
                        fStack_a4 = fVar166;
                        fStack_a0 = fVar166;
                        fStack_9c = fVar166;
                        local_98 = CONCAT44(uStack_2f4,local_2f8);
                        uStack_90 = CONCAT44(uStack_2ec,uStack_2f0);
                        local_88 = CONCAT44(uStack_2e4,local_2e8);
                        uStack_80 = CONCAT44(uStack_2dc,uStack_2e0);
                        local_78 = context->user->instID[0];
                        uStack_74 = local_78;
                        uStack_70 = local_78;
                        uStack_6c = local_78;
                        local_68 = context->user->instPrimID[0];
                        uStack_64 = local_68;
                        uStack_60 = local_68;
                        uStack_5c = local_68;
                        *(float *)(ray + k * 4 + 0x80) = fVar99;
                        local_418 = *local_400;
                        uStack_410 = local_400[1];
                        local_328.valid = (int *)&local_418;
                        local_328.geometryUserPtr = pGVar13->userPtr;
                        local_328.context = context->user;
                        local_328.ray = (RTCRayN *)ray;
                        local_328.hit = (RTCHitN *)&local_e8;
                        local_328.N = 4;
                        p_Var56 = pGVar13->occlusionFilterN;
                        if (p_Var56 != (RTCFilterFunctionN)0x0) {
                          p_Var56 = (RTCFilterFunctionN)(*p_Var56)(&local_328);
                        }
                        auVar95._0_4_ = -(uint)((int)local_418 == 0);
                        auVar95._4_4_ = -(uint)(local_418._4_4_ == 0);
                        auVar95._8_4_ = -(uint)((int)uStack_410 == 0);
                        auVar95._12_4_ = -(uint)(uStack_410._4_4_ == 0);
                        uVar63 = movmskps((int)p_Var56,auVar95);
                        pRVar57 = (RTCRayN *)(ulong)(uVar63 ^ 0xf);
                        if ((uVar63 ^ 0xf) == 0) {
                          auVar95 = auVar95 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var56 = context->args->filter;
                          if ((p_Var56 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var56)(&local_328);
                          }
                          auVar118._0_4_ = -(uint)((int)local_418 == 0);
                          auVar118._4_4_ = -(uint)(local_418._4_4_ == 0);
                          auVar118._8_4_ = -(uint)((int)uStack_410 == 0);
                          auVar118._12_4_ = -(uint)(uStack_410._4_4_ == 0);
                          auVar95 = auVar118 ^ _DAT_01febe20;
                          *(undefined1 (*) [16])(local_328.ray + 0x80) =
                               ~auVar118 & _DAT_01feba00 |
                               *(undefined1 (*) [16])(local_328.ray + 0x80) & auVar118;
                          pRVar57 = local_328.ray;
                        }
                        auVar96._0_4_ = auVar95._0_4_ << 0x1f;
                        auVar96._4_4_ = auVar95._4_4_ << 0x1f;
                        auVar96._8_4_ = auVar95._8_4_ << 0x1f;
                        auVar96._12_4_ = auVar95._12_4_ << 0x1f;
                        iVar58 = movmskps((int)pRVar57,auVar96);
                        if (iVar58 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar100;
                        }
                        uVar54 = (ulong)CONCAT31((int3)((uint)iVar58 >> 8),(char)iVar58 != '\0');
                      }
                      local_54c = (uint)(byte)((byte)local_54c | (byte)uVar54);
                      uVar59 = (ulong)local_54c;
                    }
                  }
                  break;
                }
                uVar54 = uVar54 - 1;
              } while (uVar54 != 0);
            }
            else {
              bVar26 = false;
            }
          }
        }
      }
    } while (bVar26);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }